

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse2::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse2::SubdivPatch1IntersectorK<4>,_true>::
     intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
               RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  float *pfVar6;
  int iVar7;
  ulong uVar8;
  Geometry *pGVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  char *pcVar20;
  size_t sVar21;
  RTCRayN *pRVar22;
  Device *pDVar23;
  RTCFilterFunctionN p_Var24;
  int iVar25;
  ulong uVar26;
  Geometry *pGVar27;
  RTCIntersectArguments *pRVar28;
  GridSOA *pGVar29;
  int iVar30;
  uint uVar31;
  undefined4 uVar32;
  ulong unaff_RBP;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  long lVar37;
  long lVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  float fVar52;
  float fVar63;
  float fVar64;
  float fVar65;
  undefined1 auVar53 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar54;
  undefined1 auVar55 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar62;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar86;
  float fVar104;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar105;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar106;
  float fVar122;
  float fVar123;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar124;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar125;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar138;
  float fVar139;
  float fVar144;
  float fVar147;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar145;
  float fVar146;
  float fVar148;
  float fVar149;
  float fVar150;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar157;
  float fVar158;
  float fVar159;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  int iVar199;
  float fVar200;
  int iVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  int iStack_12d0;
  undefined8 local_12b8;
  undefined8 local_1298;
  undefined8 uStack_1290;
  undefined8 local_1278;
  undefined8 uStack_1270;
  undefined8 local_1268;
  undefined8 uStack_1260;
  vbool<4> valid;
  undefined8 local_1248;
  undefined8 uStack_1240;
  undefined1 local_1238 [8];
  float fStack_1230;
  float fStack_122c;
  undefined8 local_1228;
  float fStack_1220;
  float fStack_121c;
  char *local_1210;
  ulong local_1208;
  ulong local_1200;
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  float local_1178 [4];
  undefined1 local_1168 [16];
  float local_1158 [4];
  float local_1148 [4];
  float local_1138 [4];
  float local_1128 [4];
  undefined8 local_1118;
  undefined8 uStack_1110;
  undefined8 *local_1100;
  ulong local_10f8;
  StackItemT<embree::NodeRefPtr<4>_> *local_10f0;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  int local_10d8;
  int iStack_10d4;
  int iStack_10d0;
  int iStack_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  undefined1 local_10b8 [16];
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  ulong local_1088;
  ulong local_1080;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  undefined1 local_ff8 [16];
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  undefined1 local_fc8 [16];
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  uint local_f98;
  uint uStack_f94;
  uint uStack_f90;
  uint uStack_f8c;
  uint local_f88;
  uint uStack_f84;
  uint uStack_f80;
  uint uStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 auVar154 [16];
  
  local_10f0 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar144 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar167 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar148 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar185 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar189 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar151 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar202 = fVar185 * 0.99999964;
  fVar160 = fVar189 * 0.99999964;
  fVar125 = fVar151 * 0.99999964;
  fVar185 = fVar185 * 1.0000004;
  fVar189 = fVar189 * 1.0000004;
  fVar151 = fVar151 * 1.0000004;
  uVar36 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar35 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar34 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1088 = uVar36 ^ 0x10;
  local_1080 = uVar35;
  iVar30 = (tray->tnear).field_0.i[k];
  iVar25 = (tray->tfar).field_0.i[k];
  auVar181._4_4_ = iVar25;
  auVar181._0_4_ = iVar25;
  auVar181._8_4_ = iVar25;
  auVar181._12_4_ = iVar25;
  local_1100 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_1018 = fVar144;
  fStack_1014 = fVar144;
  fStack_1010 = fVar144;
  fStack_100c = fVar144;
  local_1028 = fVar167;
  fStack_1024 = fVar167;
  fStack_1020 = fVar167;
  fStack_101c = fVar167;
  local_1038 = fVar148;
  fStack_1034 = fVar148;
  fStack_1030 = fVar148;
  fStack_102c = fVar148;
  local_1048 = fVar185;
  fStack_1044 = fVar185;
  fStack_1040 = fVar185;
  fStack_103c = fVar185;
  local_1058 = fVar189;
  fStack_1054 = fVar189;
  fStack_1050 = fVar189;
  fStack_104c = fVar189;
  local_10e8 = fVar125;
  fStack_10e4 = fVar125;
  fStack_10e0 = fVar125;
  fStack_10dc = fVar125;
  local_1078 = fVar202;
  fStack_1074 = fVar202;
  fStack_1070 = fVar202;
  fStack_106c = fVar202;
  local_10c8 = fVar160;
  fStack_10c4 = fVar160;
  fStack_10c0 = fVar160;
  fStack_10bc = fVar160;
  local_10f8 = uVar36;
  local_10d8 = iVar30;
  iStack_10d4 = iVar30;
  iStack_10d0 = iVar30;
  iStack_10cc = iVar30;
  local_1068 = fVar151;
  fStack_1064 = fVar151;
  fStack_1060 = fVar151;
  fStack_105c = fVar151;
  fVar159 = fVar144;
  fVar188 = fVar144;
  fVar63 = fVar144;
  fVar104 = fVar167;
  fVar65 = fVar167;
  fVar105 = fVar167;
  iVar25 = iVar30;
  iVar199 = iVar30;
  iVar201 = iVar30;
  fVar146 = fVar202;
  fVar106 = fVar202;
  fVar150 = fVar202;
  fVar52 = fVar125;
  fVar64 = fVar125;
  fVar86 = fVar125;
  fVar122 = fVar151;
  fVar123 = fVar151;
  fVar124 = fVar151;
  fVar138 = fVar160;
  fVar139 = fVar160;
  fVar145 = fVar160;
  fVar147 = fVar148;
  fVar149 = fVar148;
  fVar152 = fVar148;
  fVar153 = fVar185;
  fVar157 = fVar185;
  fVar158 = fVar185;
  fVar161 = fVar189;
  fVar162 = fVar189;
  fVar163 = fVar189;
  while (local_10f0 != stack) {
    pSVar15 = local_10f0 + -1;
    local_10f0 = local_10f0 + -1;
    if ((float)pSVar15->dist < *(float *)(ray + k * 4 + 0x80) ||
        (float)pSVar15->dist == *(float *)(ray + k * 4 + 0x80)) {
      uVar19 = (local_10f0->ptr).ptr;
      do {
        if ((uVar19 & 8) == 0) {
          pfVar6 = (float *)(uVar19 + 0x20 + uVar36);
          auVar66._0_4_ = (*pfVar6 - fVar144) * fVar202;
          auVar66._4_4_ = (pfVar6[1] - fVar159) * fVar146;
          auVar66._8_4_ = (pfVar6[2] - fVar188) * fVar106;
          auVar66._12_4_ = (pfVar6[3] - fVar63) * fVar150;
          pfVar6 = (float *)(uVar19 + 0x20 + local_1080);
          auVar129._0_4_ = (*pfVar6 - fVar167) * fVar160;
          auVar129._4_4_ = (pfVar6[1] - fVar104) * fVar138;
          auVar129._8_4_ = (pfVar6[2] - fVar65) * fVar139;
          auVar129._12_4_ = (pfVar6[3] - fVar105) * fVar145;
          auVar66 = maxps(auVar66,auVar129);
          pfVar6 = (float *)(uVar19 + 0x20 + uVar34);
          auVar131._0_4_ = (*pfVar6 - fVar148) * fVar125;
          auVar131._4_4_ = (pfVar6[1] - fVar147) * fVar52;
          auVar131._8_4_ = (pfVar6[2] - fVar149) * fVar64;
          auVar131._12_4_ = (pfVar6[3] - fVar152) * fVar86;
          auVar87._4_4_ = iVar25;
          auVar87._0_4_ = iVar30;
          auVar87._8_4_ = iVar199;
          auVar87._12_4_ = iVar201;
          auVar87 = maxps(auVar131,auVar87);
          tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar66,auVar87);
          pfVar6 = (float *)(uVar19 + 0x20 + local_1088);
          auVar141._0_4_ = (*pfVar6 - fVar144) * fVar185;
          auVar141._4_4_ = (pfVar6[1] - fVar159) * fVar153;
          auVar141._8_4_ = (pfVar6[2] - fVar188) * fVar157;
          auVar141._12_4_ = (pfVar6[3] - fVar63) * fVar158;
          pfVar6 = (float *)(uVar19 + 0x20 + (uVar35 ^ 0x10));
          auVar107._0_4_ = (*pfVar6 - fVar167) * fVar189;
          auVar107._4_4_ = (pfVar6[1] - fVar104) * fVar161;
          auVar107._8_4_ = (pfVar6[2] - fVar65) * fVar162;
          auVar107._12_4_ = (pfVar6[3] - fVar105) * fVar163;
          auVar87 = minps(auVar141,auVar107);
          pfVar6 = (float *)(uVar19 + 0x20 + (uVar34 ^ 0x10));
          auVar108._0_4_ = (*pfVar6 - fVar148) * fVar151;
          auVar108._4_4_ = (pfVar6[1] - fVar147) * fVar122;
          auVar108._8_4_ = (pfVar6[2] - fVar149) * fVar123;
          auVar108._12_4_ = (pfVar6[3] - fVar152) * fVar124;
          auVar66 = minps(auVar108,auVar181);
          auVar87 = minps(auVar87,auVar66);
          auVar110._4_4_ = -(uint)(tNear.field_0._4_4_ <= auVar87._4_4_);
          auVar110._0_4_ = -(uint)(tNear.field_0._0_4_ <= auVar87._0_4_);
          auVar110._8_4_ = -(uint)(tNear.field_0._8_4_ <= auVar87._8_4_);
          auVar110._12_4_ = -(uint)(tNear.field_0._12_4_ <= auVar87._12_4_);
          uVar32 = movmskps((int)unaff_RBP,auVar110);
          unaff_RBP = CONCAT44((int)(unaff_RBP >> 0x20),uVar32);
        }
        if ((uVar19 & 8) == 0) {
          if (unaff_RBP == 0) {
            iStack_12d0 = 4;
          }
          else {
            uVar26 = uVar19 & 0xfffffffffffffff0;
            lVar38 = 0;
            if (unaff_RBP != 0) {
              for (; (unaff_RBP >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
              }
            }
            iStack_12d0 = 0;
            uVar19 = *(ulong *)(uVar26 + lVar38 * 8);
            uVar33 = unaff_RBP - 1 & unaff_RBP;
            if (uVar33 != 0) {
              uVar31 = tNear.field_0.i[lVar38];
              lVar38 = 0;
              if (uVar33 != 0) {
                for (; (uVar33 >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
                }
              }
              uVar8 = *(ulong *)(uVar26 + lVar38 * 8);
              uVar18 = tNear.field_0.i[lVar38];
              uVar33 = uVar33 - 1 & uVar33;
              if (uVar33 == 0) {
                if (uVar31 < uVar18) {
                  (local_10f0->ptr).ptr = uVar8;
                  local_10f0->dist = uVar18;
                  local_10f0 = local_10f0 + 1;
                }
                else {
                  (local_10f0->ptr).ptr = uVar19;
                  local_10f0->dist = uVar31;
                  uVar19 = uVar8;
                  local_10f0 = local_10f0 + 1;
                }
              }
              else {
                auVar67._8_4_ = uVar31;
                auVar67._0_8_ = uVar19;
                auVar67._12_4_ = 0;
                auVar88._8_4_ = uVar18;
                auVar88._0_8_ = uVar8;
                auVar88._12_4_ = 0;
                lVar38 = 0;
                if (uVar33 != 0) {
                  for (; (uVar33 >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
                  }
                }
                uVar19 = *(ulong *)(uVar26 + lVar38 * 8);
                iVar7 = tNear.field_0.i[lVar38];
                auVar109._8_4_ = iVar7;
                auVar109._0_8_ = uVar19;
                auVar109._12_4_ = 0;
                auVar126._8_4_ = -(uint)((int)uVar31 < (int)uVar18);
                uVar33 = uVar33 - 1 & uVar33;
                iStack_12d0 = 0;
                fVar52 = fStack_10e4;
                fVar64 = fStack_10e0;
                fVar86 = fStack_10dc;
                fVar125 = local_10e8;
                if (uVar33 == 0) {
                  auVar126._4_4_ = auVar126._8_4_;
                  auVar126._0_4_ = auVar126._8_4_;
                  auVar126._12_4_ = auVar126._8_4_;
                  auVar87 = auVar67 & auVar126 | ~auVar126 & auVar88;
                  auVar66 = auVar88 & auVar126 | ~auVar126 & auVar67;
                  auVar127._8_4_ = -(uint)(auVar87._8_4_ < iVar7);
                  auVar127._0_8_ = CONCAT44(auVar127._8_4_,auVar127._8_4_);
                  auVar127._12_4_ = auVar127._8_4_;
                  auVar110 = auVar109 & auVar127 | ~auVar127 & auVar87;
                  auVar68._8_4_ = -(uint)(auVar66._8_4_ < auVar110._8_4_);
                  auVar68._4_4_ = auVar68._8_4_;
                  auVar68._0_4_ = auVar68._8_4_;
                  auVar68._12_4_ = auVar68._8_4_;
                  *local_10f0 = (StackItemT<embree::NodeRefPtr<4>_>)
                                (~auVar68 & auVar66 | auVar110 & auVar68);
                  local_10f0[1] =
                       (StackItemT<embree::NodeRefPtr<4>_>)(auVar66 & auVar68 | ~auVar68 & auVar110)
                  ;
                  uVar19 = ~auVar127._0_8_ & uVar19 | auVar87._0_8_ & auVar127._0_8_;
                  local_10f0 = local_10f0 + 2;
                }
                else {
                  lVar38 = 0;
                  if (uVar33 != 0) {
                    for (; (uVar33 >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
                    }
                  }
                  iVar30 = tNear.field_0.i[lVar38];
                  auVar130._8_4_ = iVar30;
                  auVar130._0_8_ = *(undefined8 *)(uVar26 + lVar38 * 8);
                  auVar130._12_4_ = 0;
                  auVar128._4_4_ = auVar126._8_4_;
                  auVar128._0_4_ = auVar126._8_4_;
                  auVar128._8_4_ = auVar126._8_4_;
                  auVar128._12_4_ = auVar126._8_4_;
                  auVar87 = auVar67 & auVar128 | ~auVar128 & auVar88;
                  auVar66 = auVar88 & auVar128 | ~auVar128 & auVar67;
                  auVar140._0_4_ = -(uint)(iVar7 < iVar30);
                  auVar140._4_4_ = -(uint)(iVar7 < iVar30);
                  auVar140._8_4_ = -(uint)(iVar7 < iVar30);
                  auVar140._12_4_ = -(uint)(iVar7 < iVar30);
                  auVar129 = auVar109 & auVar140 | ~auVar140 & auVar130;
                  auVar141 = ~auVar140 & auVar109 | auVar130 & auVar140;
                  auVar111._8_4_ = -(uint)(auVar66._8_4_ < auVar141._8_4_);
                  auVar111._4_4_ = auVar111._8_4_;
                  auVar111._0_4_ = auVar111._8_4_;
                  auVar111._12_4_ = auVar111._8_4_;
                  auVar131 = auVar66 & auVar111 | ~auVar111 & auVar141;
                  auVar89._8_4_ = -(uint)(auVar87._8_4_ < auVar129._8_4_);
                  auVar89._0_8_ = CONCAT44(auVar89._8_4_,auVar89._8_4_);
                  auVar89._12_4_ = auVar89._8_4_;
                  auVar110 = ~auVar89 & auVar87 | auVar129 & auVar89;
                  auVar69._8_4_ = -(uint)(auVar110._8_4_ < auVar131._8_4_);
                  auVar69._4_4_ = auVar69._8_4_;
                  auVar69._0_4_ = auVar69._8_4_;
                  auVar69._12_4_ = auVar69._8_4_;
                  *local_10f0 = (StackItemT<embree::NodeRefPtr<4>_>)
                                (~auVar111 & auVar66 | auVar141 & auVar111);
                  local_10f0[1] =
                       (StackItemT<embree::NodeRefPtr<4>_>)
                       (~auVar69 & auVar110 | auVar131 & auVar69);
                  local_10f0[2] =
                       (StackItemT<embree::NodeRefPtr<4>_>)
                       (auVar110 & auVar69 | ~auVar69 & auVar131);
                  uVar19 = auVar87._0_8_ & auVar89._0_8_ | ~auVar89._0_8_ & auVar129._0_8_;
                  local_10f0 = local_10f0 + 3;
                  iVar30 = local_10d8;
                  iVar25 = iStack_10d4;
                  iVar199 = iStack_10d0;
                  iVar201 = iStack_10cc;
                  fVar160 = local_10c8;
                  fVar138 = fStack_10c4;
                  fVar139 = fStack_10c0;
                  fVar145 = fStack_10bc;
                }
              }
            }
          }
        }
        else {
          iStack_12d0 = 6;
        }
      } while (iStack_12d0 == 0);
      if (iStack_12d0 == 6) {
        if (((uint)uVar19 & 0xf) == 8) {
          pGVar29 = (pre->super_Precalculations).grid;
          uVar31 = pGVar29->width;
          uVar26 = (ulong)uVar31;
          lVar38 = (uVar19 >> 4) * 4 + (ulong)pGVar29->gridOffset;
          pcVar3 = pGVar29->data + (uVar19 >> 4) * 4 + (ulong)pGVar29->gridOffset + -4;
          fVar144 = *(float *)(pcVar3 + 4);
          pcVar20 = pGVar29->data + uVar26 * 4 + lVar38 + -4;
          fVar167 = *(float *)(pcVar20 + 4);
          fVar148 = *(float *)(pcVar3 + 8);
          fVar185 = *(float *)(pcVar20 + 8);
          if (uVar26 == 2) {
            fVar148 = fVar144;
            fVar185 = fVar167;
          }
          uVar19 = (ulong)pGVar29->dim_offset;
          lVar37 = uVar19 * 4 + lVar38;
          fVar189 = *(float *)(pGVar29->data + lVar37);
          pcVar1 = pGVar29->data + lVar37 + -4 + uVar26 * 4;
          fVar151 = *(float *)(pcVar1 + 4);
          fVar159 = *(float *)(pGVar29->data + lVar37 + 4);
          fVar188 = *(float *)(pcVar1 + 8);
          if (uVar26 == 2) {
            fVar159 = fVar189;
            fVar188 = fVar151;
          }
          lVar16 = uVar19 * 8 + lVar38;
          fVar63 = *(float *)(pGVar29->data + lVar16);
          pcVar2 = pGVar29->data + lVar16 + -4 + uVar26 * 4;
          fVar104 = *(float *)(pcVar2 + 4);
          fVar65 = *(float *)(pGVar29->data + lVar16 + 4);
          fVar105 = *(float *)(pcVar2 + 8);
          if (uVar26 == 2) {
            fVar65 = fVar63;
            fVar105 = fVar104;
          }
          uVar33 = (ulong)pGVar29->height;
          lVar17 = uVar19 * 0xc + lVar38;
          local_1210 = pGVar29->data + lVar17 + -4;
          uVar18 = pGVar29->_geomID;
          uStack_1270._0_4_ = pGVar29->_primID;
          fVar202 = *(float *)(ray + k * 4);
          fVar146 = *(float *)(ray + k * 4 + 0x10);
          fVar106 = *(float *)(ray + k * 4 + 0x20);
          fVar150 = *(float *)(ray + k * 4 + 0x40);
          fVar203 = *(float *)pcVar3 - fVar202;
          fVar205 = *(float *)pcVar20 - fVar202;
          fVar207 = fVar144 - fVar202;
          fVar209 = fVar167 - fVar202;
          local_1098 = *(float *)(pGVar29->data + lVar37 + -4) - fVar146;
          fStack_1094 = *(float *)pcVar1 - fVar146;
          fStack_1090 = fVar189 - fVar146;
          fStack_108c = fVar151 - fVar146;
          fVar196 = *(float *)(pGVar29->data + lVar16 + -4) - fVar106;
          fVar197 = *(float *)pcVar2 - fVar106;
          fVar198 = fVar63 - fVar106;
          fVar200 = fVar104 - fVar106;
          fVar138 = fVar144 - fVar202;
          fVar144 = fVar144 - fVar202;
          fVar160 = fVar148 - fVar202;
          fVar148 = fVar148 - fVar202;
          fVar152 = fVar189 - fVar146;
          fVar189 = fVar189 - fVar146;
          fVar158 = fVar159 - fVar146;
          fVar159 = fVar159 - fVar146;
          fVar52 = fVar63 - fVar106;
          fVar63 = fVar63 - fVar106;
          fVar64 = fVar65 - fVar106;
          fVar65 = fVar65 - fVar106;
          fVar161 = *(float *)pcVar20 - fVar202;
          fVar164 = fVar167 - fVar202;
          fVar167 = fVar167 - fVar202;
          fVar185 = fVar185 - fVar202;
          fVar186 = *(float *)pcVar1 - fVar146;
          fVar187 = fVar151 - fVar146;
          fVar151 = fVar151 - fVar146;
          fVar188 = fVar188 - fVar146;
          fVar86 = *(float *)pcVar2 - fVar106;
          fVar125 = fVar104 - fVar106;
          fVar104 = fVar104 - fVar106;
          fVar105 = fVar105 - fVar106;
          fVar172 = fVar161 - fVar203;
          fVar174 = fVar164 - fVar205;
          fVar176 = fVar167 - fVar207;
          fVar178 = fVar185 - fVar209;
          fVar190 = fVar186 - local_1098;
          fVar192 = fVar187 - fStack_1094;
          fStack_1220 = fVar151 - fStack_1090;
          fStack_121c = fVar188 - fStack_108c;
          fVar162 = fVar86 - fVar196;
          fVar165 = fVar125 - fVar197;
          fVar168 = fVar104 - fVar198;
          fVar170 = fVar105 - fVar200;
          local_1118 = CONCAT44(fVar165,fVar162);
          uStack_1110 = CONCAT44(fVar170,fVar168);
          fVar202 = *(float *)(ray + k * 4 + 0x50);
          fVar146 = *(float *)(ray + k * 4 + 0x60);
          fVar173 = fVar203 - fVar138;
          fVar175 = fVar205 - fVar144;
          fVar177 = fVar207 - fVar160;
          fVar179 = fVar209 - fVar148;
          fVar153 = (fVar190 * (fVar86 + fVar196) - (fVar186 + local_1098) * fVar162) * fVar150 +
                    ((fVar161 + fVar203) * fVar162 - (fVar86 + fVar196) * fVar172) * fVar202 +
                    (fVar172 * (fVar186 + local_1098) - (fVar161 + fVar203) * fVar190) * fVar146;
          fVar157 = (fVar192 * (fVar125 + fVar197) - (fVar187 + fStack_1094) * fVar165) * fVar150 +
                    ((fVar164 + fVar205) * fVar165 - (fVar125 + fVar197) * fVar174) * fVar202 +
                    (fVar174 * (fVar187 + fStack_1094) - (fVar164 + fVar205) * fVar192) * fVar146;
          auVar154._0_8_ = CONCAT44(fVar157,fVar153);
          auVar154._8_4_ =
               (fStack_1220 * (fVar104 + fVar198) - (fVar151 + fStack_1090) * fVar168) * fVar150 +
               ((fVar167 + fVar207) * fVar168 - (fVar104 + fVar198) * fVar176) * fVar202 +
               (fVar176 * (fVar151 + fStack_1090) - (fVar167 + fVar207) * fStack_1220) * fVar146;
          auVar154._12_4_ =
               (fStack_121c * (fVar105 + fVar200) - (fVar188 + fStack_108c) * fVar170) * fVar150 +
               ((fVar185 + fVar209) * fVar170 - (fVar105 + fVar200) * fVar178) * fVar202 +
               (fVar178 * (fVar188 + fStack_108c) - (fVar185 + fVar209) * fStack_121c) * fVar146;
          fVar163 = local_1098 - fVar152;
          fVar166 = fStack_1094 - fVar189;
          fVar169 = fStack_1090 - fVar158;
          fVar171 = fStack_108c - fVar159;
          fVar139 = fVar196 - fVar52;
          fVar145 = fVar197 - fVar63;
          fVar147 = fVar198 - fVar64;
          fVar149 = fVar200 - fVar65;
          local_10b8._0_4_ =
               (fVar163 * (fVar196 + fVar52) - (local_1098 + fVar152) * fVar139) * fVar150 +
               ((fVar203 + fVar138) * fVar139 - (fVar196 + fVar52) * fVar173) * fVar202 +
               (fVar173 * (local_1098 + fVar152) - (fVar203 + fVar138) * fVar163) * fVar146;
          local_10b8._4_4_ =
               (fVar166 * (fVar197 + fVar63) - (fStack_1094 + fVar189) * fVar145) * fVar150 +
               ((fVar205 + fVar144) * fVar145 - (fVar197 + fVar63) * fVar175) * fVar202 +
               (fVar175 * (fStack_1094 + fVar189) - (fVar205 + fVar144) * fVar166) * fVar146;
          local_10b8._8_4_ =
               (fVar169 * (fVar198 + fVar64) - (fStack_1090 + fVar158) * fVar147) * fVar150 +
               ((fVar207 + fVar160) * fVar147 - (fVar198 + fVar64) * fVar177) * fVar202 +
               (fVar177 * (fStack_1090 + fVar158) - (fVar207 + fVar160) * fVar169) * fVar146;
          local_10b8._12_4_ =
               (fVar171 * (fVar200 + fVar65) - (fStack_108c + fVar159) * fVar149) * fVar150 +
               ((fVar209 + fVar148) * fVar149 - (fVar200 + fVar65) * fVar179) * fVar202 +
               (fVar179 * (fStack_108c + fVar159) - (fVar209 + fVar148) * fVar171) * fVar146;
          fVar106 = fVar138 - fVar161;
          fVar122 = fVar144 - fVar164;
          fVar123 = fVar160 - fVar167;
          fVar124 = fVar148 - fVar185;
          fVar204 = fVar152 - fVar186;
          fVar206 = fVar189 - fVar187;
          fVar208 = fVar158 - fVar151;
          fVar210 = fVar159 - fVar188;
          fVar191 = fVar52 - fVar86;
          fVar193 = fVar63 - fVar125;
          fVar194 = fVar64 - fVar104;
          fVar195 = fVar65 - fVar105;
          auVar53._0_4_ =
               (fVar204 * (fVar86 + fVar52) - (fVar186 + fVar152) * fVar191) * fVar150 +
               ((fVar161 + fVar138) * fVar191 - (fVar86 + fVar52) * fVar106) * fVar202 +
               (fVar106 * (fVar186 + fVar152) - (fVar161 + fVar138) * fVar204) * fVar146;
          auVar53._4_4_ =
               (fVar206 * (fVar125 + fVar63) - (fVar187 + fVar189) * fVar193) * fVar150 +
               ((fVar164 + fVar144) * fVar193 - (fVar125 + fVar63) * fVar122) * fVar202 +
               (fVar122 * (fVar187 + fVar189) - (fVar164 + fVar144) * fVar206) * fVar146;
          auVar53._8_4_ =
               (fVar208 * (fVar104 + fVar64) - (fVar151 + fVar158) * fVar194) * fVar150 +
               ((fVar167 + fVar160) * fVar194 - (fVar104 + fVar64) * fVar123) * fVar202 +
               (fVar123 * (fVar151 + fVar158) - (fVar167 + fVar160) * fVar208) * fVar146;
          auVar53._12_4_ =
               (fVar210 * (fVar105 + fVar65) - (fVar188 + fVar159) * fVar195) * fVar150 +
               ((fVar185 + fVar148) * fVar195 - (fVar105 + fVar65) * fVar124) * fVar202 +
               (fVar124 * (fVar188 + fVar159) - (fVar185 + fVar148) * fVar210) * fVar146;
          local_10a8 = fVar153 + local_10b8._0_4_ + auVar53._0_4_;
          fStack_10a4 = fVar157 + local_10b8._4_4_ + auVar53._4_4_;
          fStack_10a0 = auVar154._8_4_ + local_10b8._8_4_ + auVar53._8_4_;
          fStack_109c = auVar154._12_4_ + local_10b8._12_4_ + auVar53._12_4_;
          auVar180._8_4_ = auVar154._8_4_;
          auVar180._0_8_ = auVar154._0_8_;
          auVar180._12_4_ = auVar154._12_4_;
          auVar181 = minps(auVar180,local_10b8);
          auVar87 = minps(auVar181,auVar53);
          auVar132._8_4_ = auVar154._8_4_;
          auVar132._0_8_ = auVar154._0_8_;
          auVar132._12_4_ = auVar154._12_4_;
          auVar181 = maxps(auVar132,local_10b8);
          auVar181 = maxps(auVar181,auVar53);
          auVar133._4_4_ = -(uint)(auVar181._4_4_ <= ABS(fStack_10a4) * 1.1920929e-07);
          auVar133._0_4_ = -(uint)(auVar181._0_4_ <= ABS(local_10a8) * 1.1920929e-07);
          auVar133._8_4_ = -(uint)(auVar181._8_4_ <= ABS(fStack_10a0) * 1.1920929e-07);
          auVar133._12_4_ = -(uint)(auVar181._12_4_ <= ABS(fStack_109c) * 1.1920929e-07);
          auVar182._4_4_ = -(uint)(-(ABS(fStack_10a4) * 1.1920929e-07) <= auVar87._4_4_);
          auVar182._0_4_ = -(uint)(-(ABS(local_10a8) * 1.1920929e-07) <= auVar87._0_4_);
          auVar182._8_4_ = -(uint)(-(ABS(fStack_10a0) * 1.1920929e-07) <= auVar87._8_4_);
          auVar182._12_4_ = -(uint)(-(ABS(fStack_109c) * 1.1920929e-07) <= auVar87._12_4_);
          auVar133 = auVar133 | auVar182;
          iVar30 = movmskps((int)&local_1210,auVar133);
          if (iVar30 != 0) {
            uVar39 = -(uint)(ABS(fVar204 * fVar139) <= ABS(fVar163 * fVar162));
            uVar42 = -(uint)(ABS(fVar206 * fVar145) <= ABS(fVar166 * fVar165));
            uVar45 = -(uint)(ABS(fVar208 * fVar147) <= ABS(fVar169 * fVar168));
            uVar48 = -(uint)(ABS(fVar210 * fVar149) <= ABS(fVar171 * fVar170));
            uVar40 = -(uint)(ABS(fVar173 * fVar191) <= ABS(fVar172 * fVar139));
            uVar43 = -(uint)(ABS(fVar175 * fVar193) <= ABS(fVar174 * fVar145));
            uVar46 = -(uint)(ABS(fVar177 * fVar194) <= ABS(fVar176 * fVar147));
            uVar49 = -(uint)(ABS(fVar179 * fVar195) <= ABS(fVar178 * fVar149));
            uVar41 = -(uint)(ABS(fVar106 * fVar163) <= ABS(fVar173 * fVar190));
            uVar44 = -(uint)(ABS(fVar122 * fVar166) <= ABS(fVar175 * fVar192));
            uVar47 = -(uint)(ABS(fVar123 * fVar169) <= ABS(fVar177 * fStack_1220));
            uVar50 = -(uint)(ABS(fVar124 * fVar171) <= ABS(fVar179 * fStack_121c));
            local_1148[0] =
                 (float)(~uVar39 & (uint)(fVar190 * fVar139 - fVar163 * fVar162) |
                        (uint)(fVar163 * fVar191 - fVar204 * fVar139) & uVar39);
            local_1148[1] =
                 (float)(~uVar42 & (uint)(fVar192 * fVar145 - fVar166 * fVar165) |
                        (uint)(fVar166 * fVar193 - fVar206 * fVar145) & uVar42);
            local_1148[2] =
                 (float)(~uVar45 & (uint)(fStack_1220 * fVar147 - fVar169 * fVar168) |
                        (uint)(fVar169 * fVar194 - fVar208 * fVar147) & uVar45);
            local_1148[3] =
                 (float)(~uVar48 & (uint)(fStack_121c * fVar149 - fVar171 * fVar170) |
                        (uint)(fVar171 * fVar195 - fVar210 * fVar149) & uVar48);
            local_1138[0] =
                 (float)(~uVar40 & (uint)(fVar162 * fVar173 - fVar172 * fVar139) |
                        (uint)(fVar106 * fVar139 - fVar173 * fVar191) & uVar40);
            local_1138[1] =
                 (float)(~uVar43 & (uint)(fVar165 * fVar175 - fVar174 * fVar145) |
                        (uint)(fVar122 * fVar145 - fVar175 * fVar193) & uVar43);
            local_1138[2] =
                 (float)(~uVar46 & (uint)(fVar168 * fVar177 - fVar176 * fVar147) |
                        (uint)(fVar123 * fVar147 - fVar177 * fVar194) & uVar46);
            local_1138[3] =
                 (float)(~uVar49 & (uint)(fVar170 * fVar179 - fVar178 * fVar149) |
                        (uint)(fVar124 * fVar149 - fVar179 * fVar195) & uVar49);
            local_1128[0] =
                 (float)(~uVar41 & (uint)(fVar172 * fVar163 - fVar173 * fVar190) |
                        (uint)(fVar173 * fVar204 - fVar106 * fVar163) & uVar41);
            local_1128[1] =
                 (float)(~uVar44 & (uint)(fVar174 * fVar166 - fVar175 * fVar192) |
                        (uint)(fVar175 * fVar206 - fVar122 * fVar166) & uVar44);
            local_1128[2] =
                 (float)(~uVar47 & (uint)(fVar176 * fVar169 - fVar177 * fStack_1220) |
                        (uint)(fVar177 * fVar208 - fVar123 * fVar169) & uVar47);
            local_1128[3] =
                 (float)(~uVar50 & (uint)(fVar178 * fVar171 - fVar179 * fStack_121c) |
                        (uint)(fVar179 * fVar210 - fVar124 * fVar171) & uVar50);
            fVar144 = fVar150 * local_1148[0] + fVar202 * local_1138[0] + fVar146 * local_1128[0];
            fVar167 = fVar150 * local_1148[1] + fVar202 * local_1138[1] + fVar146 * local_1128[1];
            fVar148 = fVar150 * local_1148[2] + fVar202 * local_1138[2] + fVar146 * local_1128[2];
            fVar185 = fVar150 * local_1148[3] + fVar202 * local_1138[3] + fVar146 * local_1128[3];
            auVar90._0_4_ = fVar144 + fVar144;
            auVar90._4_4_ = fVar167 + fVar167;
            auVar90._8_4_ = fVar148 + fVar148;
            auVar90._12_4_ = fVar185 + fVar185;
            auVar112._0_4_ = local_1098 * local_1138[0] + fVar196 * local_1128[0];
            auVar112._4_4_ = fStack_1094 * local_1138[1] + fVar197 * local_1128[1];
            auVar112._8_4_ = fStack_1090 * local_1138[2] + fVar198 * local_1128[2];
            auVar112._12_4_ = fStack_108c * local_1138[3] + fVar200 * local_1128[3];
            fVar189 = fVar203 * local_1148[0] + auVar112._0_4_;
            fVar151 = fVar205 * local_1148[1] + auVar112._4_4_;
            fVar159 = fVar207 * local_1148[2] + auVar112._8_4_;
            fVar188 = fVar209 * local_1148[3] + auVar112._12_4_;
            auVar181 = rcpps(auVar112,auVar90);
            fVar144 = auVar181._0_4_;
            fVar167 = auVar181._4_4_;
            fVar148 = auVar181._8_4_;
            fVar185 = auVar181._12_4_;
            local_1158[0] =
                 ((1.0 - auVar90._0_4_ * fVar144) * fVar144 + fVar144) * (fVar189 + fVar189);
            local_1158[1] =
                 ((1.0 - auVar90._4_4_ * fVar167) * fVar167 + fVar167) * (fVar151 + fVar151);
            local_1158[2] =
                 ((1.0 - auVar90._8_4_ * fVar148) * fVar148 + fVar148) * (fVar159 + fVar159);
            local_1158[3] =
                 ((1.0 - auVar90._12_4_ * fVar185) * fVar185 + fVar185) * (fVar188 + fVar188);
            fVar144 = *(float *)(ray + k * 4 + 0x80);
            fVar167 = *(float *)(ray + k * 4 + 0x30);
            auVar113._0_4_ =
                 -(uint)(local_1158[0] <= fVar144 && fVar167 <= local_1158[0]) & auVar133._0_4_;
            auVar113._4_4_ =
                 -(uint)(local_1158[1] <= fVar144 && fVar167 <= local_1158[1]) & auVar133._4_4_;
            auVar113._8_4_ =
                 -(uint)(local_1158[2] <= fVar144 && fVar167 <= local_1158[2]) & auVar133._8_4_;
            auVar113._12_4_ =
                 -(uint)(local_1158[3] <= fVar144 && fVar167 <= local_1158[3]) & auVar133._12_4_;
            iVar30 = movmskps(iVar30,auVar113);
            if (iVar30 != 0) {
              valid.field_0.i[0] = auVar113._0_4_ & -(uint)(auVar90._0_4_ != 0.0);
              valid.field_0.i[1] = auVar113._4_4_ & -(uint)(auVar90._4_4_ != 0.0);
              valid.field_0.i[2] = auVar113._8_4_ & -(uint)(auVar90._8_4_ != 0.0);
              valid.field_0.i[3] = auVar113._12_4_ & -(uint)(auVar90._12_4_ != 0.0);
              iVar30 = movmskps(iVar30,(undefined1  [16])valid.field_0);
              if (iVar30 != 0) {
                uStack_1290 = auVar154._8_8_;
                tNear.field_0._8_8_ = uStack_1290;
                tNear.field_0._0_8_ = auVar154._0_8_;
                auVar13._4_4_ = fStack_10a4;
                auVar13._0_4_ = local_10a8;
                auVar13._8_4_ = fStack_10a0;
                auVar13._12_4_ = fStack_109c;
                pGVar9 = (context->scene->geometries).items[uVar18].ptr;
                if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  auVar181 = rcpps((undefined1  [16])valid.field_0,auVar13);
                  fVar144 = auVar181._0_4_;
                  fVar167 = auVar181._4_4_;
                  fVar148 = auVar181._8_4_;
                  fVar185 = auVar181._12_4_;
                  fVar144 = (float)(-(uint)(1e-18 <= ABS(local_10a8)) &
                                   (uint)(((float)DAT_01feca10 - local_10a8 * fVar144) * fVar144 +
                                         fVar144));
                  fVar167 = (float)(-(uint)(1e-18 <= ABS(fStack_10a4)) &
                                   (uint)((DAT_01feca10._4_4_ - fStack_10a4 * fVar167) * fVar167 +
                                         fVar167));
                  fVar148 = (float)(-(uint)(1e-18 <= ABS(fStack_10a0)) &
                                   (uint)((DAT_01feca10._8_4_ - fStack_10a0 * fVar148) * fVar148 +
                                         fVar148));
                  fVar185 = (float)(-(uint)(1e-18 <= ABS(fStack_109c)) &
                                   (uint)((DAT_01feca10._12_4_ - fStack_109c * fVar185) * fVar185 +
                                         fVar185));
                  auVar91._0_4_ = fVar153 * fVar144;
                  auVar91._4_4_ = fVar157 * fVar167;
                  auVar91._8_4_ = auVar154._8_4_ * fVar148;
                  auVar91._12_4_ = auVar154._12_4_ * fVar185;
                  auVar87 = minps(auVar91,_DAT_01feca10);
                  auVar70._0_4_ = fVar144 * local_10b8._0_4_;
                  auVar70._4_4_ = fVar167 * local_10b8._4_4_;
                  auVar70._8_4_ = fVar148 * local_10b8._8_4_;
                  auVar70._12_4_ = fVar185 * local_10b8._12_4_;
                  auVar181 = minps(auVar70,_DAT_01feca10);
                  uVar39 = *(uint *)(pGVar29->data + lVar17);
                  pcVar3 = local_1210 + uVar26 * 4;
                  uVar40 = *(uint *)pcVar3;
                  uVar41 = *(uint *)(pcVar3 + 4);
                  uVar42 = *(uint *)(pGVar29->data + lVar17 + 4);
                  uVar43 = *(uint *)(pcVar3 + 8);
                  if (uVar26 == 2) {
                    uVar42 = uVar39;
                    uVar43 = uVar41;
                  }
                  fVar189 = auVar87._0_4_;
                  fVar151 = auVar87._4_4_;
                  fVar159 = auVar87._8_4_;
                  fVar188 = auVar87._12_4_;
                  fVar144 = auVar181._0_4_;
                  fVar167 = auVar181._4_4_;
                  fVar148 = auVar181._8_4_;
                  fVar185 = auVar181._12_4_;
                  fVar63 = (1.0 - fVar189) - fVar144;
                  fVar104 = (1.0 - fVar151) - fVar167;
                  fVar65 = (1.0 - fVar159) - fVar148;
                  fVar105 = (1.0 - fVar188) - fVar185;
                  local_1168._0_4_ =
                       fVar63 * (float)(*(uint *)local_1210 >> 0x10) * 0.00012207031 +
                       (float)(uVar40 >> 0x10) * 0.00012207031 * fVar144 +
                       (float)(uVar39 >> 0x10) * 0.00012207031 * fVar189;
                  local_1168._4_4_ =
                       fVar104 * (float)(uVar40 >> 0x10) * 0.00012207031 +
                       (float)(uVar41 >> 0x10) * 0.00012207031 * fVar167 +
                       (float)(uVar39 >> 0x10) * 0.00012207031 * fVar151;
                  local_1168._8_4_ =
                       fVar65 * (float)(uVar39 >> 0x10) * 0.00012207031 +
                       (float)(uVar41 >> 0x10) * 0.00012207031 * fVar148 +
                       (float)(uVar42 >> 0x10) * 0.00012207031 * fVar159;
                  local_1168._12_4_ =
                       fVar105 * (float)(uVar41 >> 0x10) * 0.00012207031 +
                       (float)(uVar43 >> 0x10) * 0.00012207031 * fVar185 +
                       (float)(uVar42 >> 0x10) * 0.00012207031 * fVar188;
                  local_1178[1] =
                       (float)(uVar40 & 0xffff) * 0.00012207031 * fVar104 +
                       (float)(uVar41 & 0xffff) * 0.00012207031 * fVar167 +
                       (float)(uVar39 & 0xffff) * 0.00012207031 * fVar151;
                  local_1178[0] =
                       (float)(*(uint *)local_1210 & 0xffff) * 0.00012207031 * fVar63 +
                       (float)(uVar40 & 0xffff) * 0.00012207031 * fVar144 +
                       (float)(uVar39 & 0xffff) * 0.00012207031 * fVar189;
                  local_1178[2] =
                       (float)(uVar39 & 0xffff) * 0.00012207031 * fVar65 +
                       (float)(uVar41 & 0xffff) * 0.00012207031 * fVar148 +
                       (float)(uVar42 & 0xffff) * 0.00012207031 * fVar159;
                  local_1178[3] =
                       (float)(uVar41 & 0xffff) * 0.00012207031 * fVar105 +
                       (float)(uVar43 & 0xffff) * 0.00012207031 * fVar185 +
                       (float)(uVar42 & 0xffff) * 0.00012207031 * fVar188;
                  auVar156._4_4_ = local_1158[1];
                  auVar156._0_4_ = local_1158[0];
                  auVar156._8_4_ = local_1158[2];
                  auVar156._12_4_ = local_1158[3];
                  auVar87 = ~(undefined1  [16])valid.field_0 & _DAT_01feb9f0 |
                            auVar156 & (undefined1  [16])valid.field_0;
                  auVar114._4_4_ = auVar87._0_4_;
                  auVar114._0_4_ = auVar87._4_4_;
                  auVar114._8_4_ = auVar87._12_4_;
                  auVar114._12_4_ = auVar87._8_4_;
                  auVar181 = minps(auVar114,auVar87);
                  auVar71._0_8_ = auVar181._8_8_;
                  auVar71._8_4_ = auVar181._0_4_;
                  auVar71._12_4_ = auVar181._4_4_;
                  auVar181 = minps(auVar71,auVar181);
                  auVar72._0_8_ =
                       CONCAT44(-(uint)(auVar181._4_4_ == auVar87._4_4_) & valid.field_0.i[1],
                                -(uint)(auVar181._0_4_ == auVar87._0_4_) & valid.field_0.i[0]);
                  auVar72._8_4_ = -(uint)(auVar181._8_4_ == auVar87._8_4_) & valid.field_0.i[2];
                  auVar72._12_4_ = -(uint)(auVar181._12_4_ == auVar87._12_4_) & valid.field_0.i[3];
                  iVar30 = movmskps(uVar31,auVar72);
                  aVar54 = valid.field_0;
                  if (iVar30 != 0) {
                    aVar54.i[2] = auVar72._8_4_;
                    aVar54._0_8_ = auVar72._0_8_;
                    aVar54.i[3] = auVar72._12_4_;
                  }
                  uVar39 = movmskps(iVar30,(undefined1  [16])aVar54);
                  lVar37 = 0;
                  if (uVar39 != 0) {
                    for (; (uVar39 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
                    }
                  }
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar144 = local_1178[lVar37];
                    fVar167 = local_1158[lVar37 + -4];
                    fVar148 = local_1148[lVar37];
                    fVar185 = local_1138[lVar37];
                    fVar189 = local_1128[lVar37];
                    *(float *)(ray + k * 4 + 0x80) = local_1158[lVar37];
                    *(float *)(ray + k * 4 + 0xc0) = fVar148;
                    *(float *)(ray + k * 4 + 0xd0) = fVar185;
                    *(float *)(ray + k * 4 + 0xe0) = fVar189;
                    *(float *)(ray + k * 4 + 0xf0) = fVar144;
                    *(float *)(ray + k * 4 + 0x100) = fVar167;
                    *(uint *)(ray + k * 4 + 0x110) = (uint)uStack_1270;
                    *(uint *)(ray + k * 4 + 0x120) = uVar18;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    uVar36 = local_10f8;
                  }
                  else {
                    local_1268 = CONCAT44(uVar18,uVar18);
                    uStack_1260 = CONCAT44(uVar18,uVar18);
                    local_1278 = CONCAT44((uint)uStack_1270,(uint)uStack_1270);
                    uStack_1270._4_4_ = (uint)uStack_1270;
                    local_1118 = *local_1100;
                    uStack_1110 = local_1100[1];
                    _local_1238 = auVar156;
                    local_1228 = uVar33;
                    local_1208 = uVar26;
                    local_1200 = uVar33;
                    do {
                      uVar32 = *(undefined4 *)(ray + k * 4 + 0x80);
                      local_fd8 = local_1178[lVar37];
                      fVar144 = local_1158[lVar37 + -4];
                      *(float *)(ray + k * 4 + 0x80) = local_1158[lVar37];
                      args.context = context->user;
                      local_fc8._4_4_ = fVar144;
                      local_fc8._0_4_ = fVar144;
                      local_fc8._8_4_ = fVar144;
                      local_fc8._12_4_ = fVar144;
                      local_1008 = local_1148[lVar37];
                      fVar144 = local_1138[lVar37];
                      local_fe8 = local_1128[lVar37];
                      local_ff8._4_4_ = fVar144;
                      local_ff8._0_4_ = fVar144;
                      local_ff8._8_4_ = fVar144;
                      local_ff8._12_4_ = fVar144;
                      fStack_1004 = local_1008;
                      fStack_1000 = local_1008;
                      fStack_ffc = local_1008;
                      fStack_fe4 = local_fe8;
                      fStack_fe0 = local_fe8;
                      fStack_fdc = local_fe8;
                      fStack_fd4 = local_fd8;
                      fStack_fd0 = local_fd8;
                      fStack_fcc = local_fd8;
                      local_fb8 = local_1278;
                      uStack_fb0 = uStack_1270;
                      local_fa8 = local_1268;
                      uStack_fa0 = uStack_1260;
                      local_f98 = (args.context)->instID[0];
                      uStack_f94 = local_f98;
                      uStack_f90 = local_f98;
                      uStack_f8c = local_f98;
                      local_f88 = (args.context)->instPrimID[0];
                      uStack_f84 = local_f88;
                      uStack_f80 = local_f88;
                      uStack_f7c = local_f88;
                      local_1248 = local_1118;
                      uStack_1240 = uStack_1110;
                      args.valid = (int *)&local_1248;
                      pGVar27 = (Geometry *)pGVar9->userPtr;
                      args.hit = (RTCHitN *)&local_1008;
                      args.N = 4;
                      p_Var24 = pGVar9->intersectionFilterN;
                      args.geometryUserPtr = pGVar27;
                      args.ray = (RTCRayN *)ray;
                      if (p_Var24 != (RTCFilterFunctionN)0x0) {
                        p_Var24 = (RTCFilterFunctionN)(*p_Var24)(&args);
                        uVar33 = local_1228;
                        auVar156 = _local_1238;
                      }
                      auVar57._0_4_ = -(uint)((int)local_1248 == 0);
                      auVar57._4_4_ = -(uint)(local_1248._4_4_ == 0);
                      auVar57._8_4_ = -(uint)((int)uStack_1240 == 0);
                      auVar57._12_4_ = -(uint)(uStack_1240._4_4_ == 0);
                      uVar18 = movmskps((int)p_Var24,auVar57);
                      pRVar22 = (RTCRayN *)(ulong)(uVar18 ^ 0xf);
                      if ((uVar18 ^ 0xf) == 0) {
                        auVar57 = auVar57 ^ _DAT_01febe20;
                      }
                      else {
                        pGVar27 = (Geometry *)context->args;
                        pDVar23 = pGVar27->device;
                        if ((pDVar23 != (Device *)0x0) &&
                           ((((ulong)(pGVar27->super_RefCount)._vptr_RefCount & 2) != 0 ||
                            (pGVar27 = pGVar9, ((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                          pDVar23 = (Device *)(*(code *)pDVar23)(&args);
                          uVar33 = local_1228;
                          auVar156 = _local_1238;
                        }
                        auVar76._0_4_ = -(uint)((int)local_1248 == 0);
                        auVar76._4_4_ = -(uint)(local_1248._4_4_ == 0);
                        auVar76._8_4_ = -(uint)((int)uStack_1240 == 0);
                        auVar76._12_4_ = -(uint)(uStack_1240._4_4_ == 0);
                        auVar57 = auVar76 ^ _DAT_01febe20;
                        uVar18 = movmskps((int)pDVar23,auVar76);
                        pRVar22 = (RTCRayN *)(ulong)(uVar18 ^ 0xf);
                        if ((uVar18 ^ 0xf) != 0) {
                          auVar94._0_4_ = *(uint *)(args.ray + 0xc0) & auVar76._0_4_;
                          auVar94._4_4_ = *(uint *)(args.ray + 0xc4) & auVar76._4_4_;
                          auVar94._8_4_ = *(uint *)(args.ray + 200) & auVar76._8_4_;
                          auVar94._12_4_ = *(uint *)(args.ray + 0xcc) & auVar76._12_4_;
                          auVar142._0_4_ = ~auVar76._0_4_ & *(uint *)args.hit;
                          auVar142._4_4_ = ~auVar76._4_4_ & *(uint *)(args.hit + 4);
                          auVar142._8_4_ = ~auVar76._8_4_ & *(uint *)(args.hit + 8);
                          auVar142._12_4_ = ~auVar76._12_4_ & *(uint *)(args.hit + 0xc);
                          *(undefined1 (*) [16])(args.ray + 0xc0) = auVar142 | auVar94;
                          uVar18 = *(uint *)(args.hit + 0x14);
                          uVar39 = *(uint *)(args.hit + 0x18);
                          uVar40 = *(uint *)(args.hit + 0x1c);
                          *(uint *)(args.ray + 0xd0) =
                               ~auVar76._0_4_ & *(uint *)(args.hit + 0x10) |
                               *(uint *)(args.ray + 0xd0) & auVar76._0_4_;
                          *(uint *)(args.ray + 0xd4) =
                               ~auVar76._4_4_ & uVar18 | *(uint *)(args.ray + 0xd4) & auVar76._4_4_;
                          *(uint *)(args.ray + 0xd8) =
                               ~auVar76._8_4_ & uVar39 | *(uint *)(args.ray + 0xd8) & auVar76._8_4_;
                          *(uint *)(args.ray + 0xdc) =
                               ~auVar76._12_4_ & uVar40 |
                               *(uint *)(args.ray + 0xdc) & auVar76._12_4_;
                          uVar18 = *(uint *)(args.hit + 0x24);
                          uVar39 = *(uint *)(args.hit + 0x28);
                          uVar40 = *(uint *)(args.hit + 0x2c);
                          *(uint *)(args.ray + 0xe0) =
                               ~auVar76._0_4_ & *(uint *)(args.hit + 0x20) |
                               *(uint *)(args.ray + 0xe0) & auVar76._0_4_;
                          *(uint *)(args.ray + 0xe4) =
                               ~auVar76._4_4_ & uVar18 | *(uint *)(args.ray + 0xe4) & auVar76._4_4_;
                          *(uint *)(args.ray + 0xe8) =
                               ~auVar76._8_4_ & uVar39 | *(uint *)(args.ray + 0xe8) & auVar76._8_4_;
                          *(uint *)(args.ray + 0xec) =
                               ~auVar76._12_4_ & uVar40 |
                               *(uint *)(args.ray + 0xec) & auVar76._12_4_;
                          auVar136._0_4_ = *(uint *)(args.ray + 0xf0) & auVar76._0_4_;
                          auVar136._4_4_ = *(uint *)(args.ray + 0xf4) & auVar76._4_4_;
                          auVar136._8_4_ = *(uint *)(args.ray + 0xf8) & auVar76._8_4_;
                          auVar136._12_4_ = *(uint *)(args.ray + 0xfc) & auVar76._12_4_;
                          auVar95._0_4_ = ~auVar76._0_4_ & *(uint *)(args.hit + 0x30);
                          auVar95._4_4_ = ~auVar76._4_4_ & *(uint *)(args.hit + 0x34);
                          auVar95._8_4_ = ~auVar76._8_4_ & *(uint *)(args.hit + 0x38);
                          auVar95._12_4_ = ~auVar76._12_4_ & *(uint *)(args.hit + 0x3c);
                          *(undefined1 (*) [16])(args.ray + 0xf0) = auVar95 | auVar136;
                          uVar18 = *(uint *)(args.hit + 0x44);
                          uVar39 = *(uint *)(args.hit + 0x48);
                          uVar40 = *(uint *)(args.hit + 0x4c);
                          *(uint *)(args.ray + 0x100) =
                               ~auVar76._0_4_ & *(uint *)(args.hit + 0x40) |
                               *(uint *)(args.ray + 0x100) & auVar76._0_4_;
                          *(uint *)(args.ray + 0x104) =
                               ~auVar76._4_4_ & uVar18 | *(uint *)(args.ray + 0x104) & auVar76._4_4_
                          ;
                          *(uint *)(args.ray + 0x108) =
                               ~auVar76._8_4_ & uVar39 | *(uint *)(args.ray + 0x108) & auVar76._8_4_
                          ;
                          *(uint *)(args.ray + 0x10c) =
                               ~auVar76._12_4_ & uVar40 |
                               *(uint *)(args.ray + 0x10c) & auVar76._12_4_;
                          uVar18 = *(uint *)(args.hit + 0x54);
                          uVar39 = *(uint *)(args.hit + 0x58);
                          uVar40 = *(uint *)(args.hit + 0x5c);
                          *(uint *)(args.ray + 0x110) =
                               *(uint *)(args.ray + 0x110) & auVar76._0_4_ |
                               ~auVar76._0_4_ & *(uint *)(args.hit + 0x50);
                          *(uint *)(args.ray + 0x114) =
                               *(uint *)(args.ray + 0x114) & auVar76._4_4_ | ~auVar76._4_4_ & uVar18
                          ;
                          *(uint *)(args.ray + 0x118) =
                               *(uint *)(args.ray + 0x118) & auVar76._8_4_ | ~auVar76._8_4_ & uVar39
                          ;
                          *(uint *)(args.ray + 0x11c) =
                               *(uint *)(args.ray + 0x11c) & auVar76._12_4_ |
                               ~auVar76._12_4_ & uVar40;
                          uVar18 = *(uint *)(args.hit + 100);
                          uVar39 = *(uint *)(args.hit + 0x68);
                          uVar40 = *(uint *)(args.hit + 0x6c);
                          *(uint *)(args.ray + 0x120) =
                               *(uint *)(args.ray + 0x120) & auVar76._0_4_ |
                               ~auVar76._0_4_ & *(uint *)(args.hit + 0x60);
                          *(uint *)(args.ray + 0x124) =
                               *(uint *)(args.ray + 0x124) & auVar76._4_4_ | ~auVar76._4_4_ & uVar18
                          ;
                          *(uint *)(args.ray + 0x128) =
                               *(uint *)(args.ray + 0x128) & auVar76._8_4_ | ~auVar76._8_4_ & uVar39
                          ;
                          *(uint *)(args.ray + 300) =
                               *(uint *)(args.ray + 300) & auVar76._12_4_ | ~auVar76._12_4_ & uVar40
                          ;
                          auVar96._0_4_ = *(uint *)(args.ray + 0x130) & auVar76._0_4_;
                          auVar96._4_4_ = *(uint *)(args.ray + 0x134) & auVar76._4_4_;
                          auVar96._8_4_ = *(uint *)(args.ray + 0x138) & auVar76._8_4_;
                          auVar96._12_4_ = *(uint *)(args.ray + 0x13c) & auVar76._12_4_;
                          auVar118._0_4_ = ~auVar76._0_4_ & *(uint *)(args.hit + 0x70);
                          auVar118._4_4_ = ~auVar76._4_4_ & *(uint *)(args.hit + 0x74);
                          auVar118._8_4_ = ~auVar76._8_4_ & *(uint *)(args.hit + 0x78);
                          auVar118._12_4_ = ~auVar76._12_4_ & *(uint *)(args.hit + 0x7c);
                          *(undefined1 (*) [16])(args.ray + 0x130) = auVar118 | auVar96;
                          auVar97._0_4_ = *(uint *)(args.ray + 0x140) & auVar76._0_4_;
                          auVar97._4_4_ = *(uint *)(args.ray + 0x144) & auVar76._4_4_;
                          auVar97._8_4_ = *(uint *)(args.ray + 0x148) & auVar76._8_4_;
                          auVar97._12_4_ = *(uint *)(args.ray + 0x14c) & auVar76._12_4_;
                          auVar77._0_4_ = ~auVar76._0_4_ & *(uint *)(args.hit + 0x80);
                          auVar77._4_4_ = ~auVar76._4_4_ & *(uint *)(args.hit + 0x84);
                          auVar77._8_4_ = ~auVar76._8_4_ & *(uint *)(args.hit + 0x88);
                          auVar77._12_4_ = ~auVar76._12_4_ & *(uint *)(args.hit + 0x8c);
                          *(undefined1 (*) [16])(args.ray + 0x140) = auVar77 | auVar97;
                          pRVar22 = args.ray;
                          pGVar27 = (Geometry *)args.hit;
                        }
                      }
                      auVar58._0_4_ = auVar57._0_4_ << 0x1f;
                      auVar58._4_4_ = auVar57._4_4_ << 0x1f;
                      auVar58._8_4_ = auVar57._8_4_ << 0x1f;
                      auVar58._12_4_ = auVar57._12_4_ << 0x1f;
                      iVar30 = movmskps((int)pRVar22,auVar58);
                      if (iVar30 == 0) {
                        *(undefined4 *)(ray + k * 4 + 0x80) = uVar32;
                      }
                      valid.field_0.v[lVar37] = 0.0;
                      fVar144 = *(float *)(ray + k * 4 + 0x80);
                      valid.field_0.i[0] = -(uint)(auVar156._0_4_ <= fVar144) & valid.field_0.i[0];
                      valid.field_0.i[1] = -(uint)(auVar156._4_4_ <= fVar144) & valid.field_0.i[1];
                      valid.field_0.i[2] = -(uint)(auVar156._8_4_ <= fVar144) & valid.field_0.i[2];
                      valid.field_0.i[3] = -(uint)(auVar156._12_4_ <= fVar144) & valid.field_0.i[3];
                      iVar30 = movmskps(iVar30,(undefined1  [16])valid.field_0);
                      if (iVar30 != 0) {
                        auVar78._0_4_ = valid.field_0.i[0] & (uint)auVar156._0_4_;
                        auVar78._4_4_ = valid.field_0.i[1] & (uint)auVar156._4_4_;
                        auVar78._8_4_ = valid.field_0.i[2] & (uint)auVar156._8_4_;
                        auVar78._12_4_ = valid.field_0.i[3] & (uint)auVar156._12_4_;
                        auVar98._0_8_ =
                             CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) & 0x7f8000007f800000;
                        auVar98._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                        auVar98._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                        auVar98 = auVar98 | auVar78;
                        auVar119._4_4_ = auVar98._0_4_;
                        auVar119._0_4_ = auVar98._4_4_;
                        auVar119._8_4_ = auVar98._12_4_;
                        auVar119._12_4_ = auVar98._8_4_;
                        auVar181 = minps(auVar119,auVar98);
                        auVar79._0_8_ = auVar181._8_8_;
                        auVar79._8_4_ = auVar181._0_4_;
                        auVar79._12_4_ = auVar181._4_4_;
                        auVar181 = minps(auVar79,auVar181);
                        auVar80._0_8_ =
                             CONCAT44(-(uint)(auVar181._4_4_ == auVar98._4_4_) & valid.field_0.i[1],
                                      -(uint)(auVar181._0_4_ == auVar98._0_4_) & valid.field_0.i[0])
                        ;
                        auVar80._8_4_ =
                             -(uint)(auVar181._8_4_ == auVar98._8_4_) & valid.field_0.i[2];
                        auVar80._12_4_ =
                             -(uint)(auVar181._12_4_ == auVar98._12_4_) & valid.field_0.i[3];
                        iVar25 = movmskps((int)pGVar27,auVar80);
                        aVar59 = valid.field_0;
                        if (iVar25 != 0) {
                          aVar59.i[2] = auVar80._8_4_;
                          aVar59._0_8_ = auVar80._0_8_;
                          aVar59.i[3] = auVar80._12_4_;
                        }
                        uVar32 = movmskps(iVar25,(undefined1  [16])aVar59);
                        uVar36 = CONCAT44((int)((ulong)pGVar27 >> 0x20),uVar32);
                        lVar37 = 0;
                        if (uVar36 != 0) {
                          for (; (uVar36 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
                          }
                        }
                      }
                      uVar36 = local_10f8;
                    } while ((char)iVar30 != '\0');
                  }
                }
              }
            }
          }
          if (2 < (uint)uVar33) {
            lVar38 = uVar26 * 4 + lVar38;
            pcVar20 = pGVar29->data + lVar38 + -4;
            fVar144 = *(float *)(pGVar29->data + lVar38);
            pcVar3 = pcVar20 + uVar26 * 4;
            fVar167 = *(float *)(pcVar3 + 4);
            fVar148 = *(float *)(pGVar29->data + lVar38 + 4);
            fVar185 = *(float *)(pcVar3 + 8);
            if (uVar26 == 2) {
              fVar148 = fVar144;
              fVar185 = fVar167;
            }
            pGVar29 = (pre->super_Precalculations).grid;
            uVar19 = (ulong)pGVar29->dim_offset;
            pcVar1 = pcVar20 + uVar19 * 4;
            fVar189 = *(float *)(pcVar1 + 4);
            pcVar2 = pcVar1 + uVar26 * 4;
            fVar151 = *(float *)(pcVar2 + 4);
            fVar159 = *(float *)(pcVar1 + 8);
            fVar188 = *(float *)(pcVar2 + 8);
            if (uVar26 == 2) {
              fVar159 = fVar189;
              fVar188 = fVar151;
            }
            pcVar4 = pcVar20 + uVar19 * 8;
            fVar63 = *(float *)(pcVar4 + 4);
            pcVar5 = pcVar4 + uVar26 * 4;
            fVar104 = *(float *)(pcVar5 + 4);
            fVar65 = *(float *)(pcVar4 + 8);
            fVar105 = *(float *)(pcVar5 + 8);
            if (uVar26 == 2) {
              fVar65 = fVar63;
              fVar105 = fVar104;
            }
            local_1210 = pcVar20 + uVar19 * 0xc;
            uVar18 = pGVar29->_geomID;
            uVar39 = pGVar29->_primID;
            fVar202 = *(float *)(ray + k * 4);
            fVar146 = *(float *)(ray + k * 4 + 0x10);
            fVar106 = *(float *)(ray + k * 4 + 0x20);
            fVar150 = *(float *)(ray + k * 4 + 0x40);
            local_1238._0_4_ = *(float *)pcVar20 - fVar202;
            local_1238._4_4_ = *(float *)pcVar3 - fVar202;
            fStack_1230 = fVar144 - fVar202;
            fStack_122c = fVar167 - fVar202;
            local_1098 = *(float *)pcVar1 - fVar146;
            fStack_1094 = *(float *)pcVar2 - fVar146;
            fStack_1090 = fVar189 - fVar146;
            fStack_108c = fVar151 - fVar146;
            fVar196 = *(float *)pcVar4 - fVar106;
            fVar197 = *(float *)pcVar5 - fVar106;
            fVar198 = fVar63 - fVar106;
            fVar200 = fVar104 - fVar106;
            fVar138 = fVar144 - fVar202;
            fVar144 = fVar144 - fVar202;
            fVar160 = fVar148 - fVar202;
            fVar148 = fVar148 - fVar202;
            fVar152 = fVar189 - fVar146;
            fVar189 = fVar189 - fVar146;
            fVar158 = fVar159 - fVar146;
            fVar159 = fVar159 - fVar146;
            fVar52 = fVar63 - fVar106;
            fVar63 = fVar63 - fVar106;
            fVar64 = fVar65 - fVar106;
            fVar65 = fVar65 - fVar106;
            fVar161 = *(float *)pcVar3 - fVar202;
            fVar164 = fVar167 - fVar202;
            fVar167 = fVar167 - fVar202;
            fVar185 = fVar185 - fVar202;
            fVar186 = *(float *)pcVar2 - fVar146;
            fVar187 = fVar151 - fVar146;
            fVar151 = fVar151 - fVar146;
            fVar188 = fVar188 - fVar146;
            fVar86 = *(float *)pcVar5 - fVar106;
            fVar125 = fVar104 - fVar106;
            fVar104 = fVar104 - fVar106;
            fVar105 = fVar105 - fVar106;
            fVar172 = fVar161 - (float)local_1238._0_4_;
            fVar174 = fVar164 - (float)local_1238._4_4_;
            fVar176 = fVar167 - fStack_1230;
            fVar178 = fVar185 - fStack_122c;
            fVar190 = fVar186 - local_1098;
            fVar192 = fVar187 - fStack_1094;
            fStack_1220 = fVar151 - fStack_1090;
            fStack_121c = fVar188 - fStack_108c;
            fVar162 = fVar86 - fVar196;
            fVar165 = fVar125 - fVar197;
            fVar168 = fVar104 - fVar198;
            fVar170 = fVar105 - fVar200;
            local_1118 = CONCAT44(fVar165,fVar162);
            uStack_1110 = CONCAT44(fVar170,fVar168);
            fVar202 = *(float *)(ray + k * 4 + 0x50);
            local_1228 = CONCAT44(fVar192,fVar190);
            fVar146 = *(float *)(ray + k * 4 + 0x60);
            fVar173 = (float)local_1238._0_4_ - fVar138;
            fVar175 = (float)local_1238._4_4_ - fVar144;
            fVar177 = fStack_1230 - fVar160;
            fVar179 = fStack_122c - fVar148;
            fVar153 = (fVar190 * (fVar86 + fVar196) - (fVar186 + local_1098) * fVar162) * fVar150 +
                      ((fVar161 + (float)local_1238._0_4_) * fVar162 - (fVar86 + fVar196) * fVar172)
                      * fVar202 +
                      (fVar172 * (fVar186 + local_1098) -
                      (fVar161 + (float)local_1238._0_4_) * fVar190) * fVar146;
            fVar157 = (fVar192 * (fVar125 + fVar197) - (fVar187 + fStack_1094) * fVar165) * fVar150
                      + ((fVar164 + (float)local_1238._4_4_) * fVar165 -
                        (fVar125 + fVar197) * fVar174) * fVar202 +
                        (fVar174 * (fVar187 + fStack_1094) -
                        (fVar164 + (float)local_1238._4_4_) * fVar192) * fVar146;
            auVar155._0_8_ = CONCAT44(fVar157,fVar153);
            auVar155._8_4_ =
                 (fStack_1220 * (fVar104 + fVar198) - (fVar151 + fStack_1090) * fVar168) * fVar150 +
                 ((fVar167 + fStack_1230) * fVar168 - (fVar104 + fVar198) * fVar176) * fVar202 +
                 (fVar176 * (fVar151 + fStack_1090) - (fVar167 + fStack_1230) * fStack_1220) *
                 fVar146;
            auVar155._12_4_ =
                 (fStack_121c * (fVar105 + fVar200) - (fVar188 + fStack_108c) * fVar170) * fVar150 +
                 ((fVar185 + fStack_122c) * fVar170 - (fVar105 + fVar200) * fVar178) * fVar202 +
                 (fVar178 * (fVar188 + fStack_108c) - (fVar185 + fStack_122c) * fStack_121c) *
                 fVar146;
            fVar163 = local_1098 - fVar152;
            fVar166 = fStack_1094 - fVar189;
            fVar169 = fStack_1090 - fVar158;
            fVar171 = fStack_108c - fVar159;
            fVar139 = fVar196 - fVar52;
            fVar145 = fVar197 - fVar63;
            fVar147 = fVar198 - fVar64;
            fVar149 = fVar200 - fVar65;
            local_10b8._0_4_ =
                 (fVar163 * (fVar196 + fVar52) - (local_1098 + fVar152) * fVar139) * fVar150 +
                 (((float)local_1238._0_4_ + fVar138) * fVar139 - (fVar196 + fVar52) * fVar173) *
                 fVar202 + (fVar173 * (local_1098 + fVar152) -
                           ((float)local_1238._0_4_ + fVar138) * fVar163) * fVar146;
            local_10b8._4_4_ =
                 (fVar166 * (fVar197 + fVar63) - (fStack_1094 + fVar189) * fVar145) * fVar150 +
                 (((float)local_1238._4_4_ + fVar144) * fVar145 - (fVar197 + fVar63) * fVar175) *
                 fVar202 + (fVar175 * (fStack_1094 + fVar189) -
                           ((float)local_1238._4_4_ + fVar144) * fVar166) * fVar146;
            local_10b8._8_4_ =
                 (fVar169 * (fVar198 + fVar64) - (fStack_1090 + fVar158) * fVar147) * fVar150 +
                 ((fStack_1230 + fVar160) * fVar147 - (fVar198 + fVar64) * fVar177) * fVar202 +
                 (fVar177 * (fStack_1090 + fVar158) - (fStack_1230 + fVar160) * fVar169) * fVar146;
            local_10b8._12_4_ =
                 (fVar171 * (fVar200 + fVar65) - (fStack_108c + fVar159) * fVar149) * fVar150 +
                 ((fStack_122c + fVar148) * fVar149 - (fVar200 + fVar65) * fVar179) * fVar202 +
                 (fVar179 * (fStack_108c + fVar159) - (fStack_122c + fVar148) * fVar171) * fVar146;
            fVar106 = fVar138 - fVar161;
            fVar122 = fVar144 - fVar164;
            fVar123 = fVar160 - fVar167;
            fVar124 = fVar148 - fVar185;
            fVar203 = fVar152 - fVar186;
            fVar204 = fVar189 - fVar187;
            fVar205 = fVar158 - fVar151;
            fVar206 = fVar159 - fVar188;
            fVar191 = fVar52 - fVar86;
            fVar193 = fVar63 - fVar125;
            fVar194 = fVar64 - fVar104;
            fVar195 = fVar65 - fVar105;
            auVar55._0_4_ =
                 (fVar203 * (fVar86 + fVar52) - (fVar186 + fVar152) * fVar191) * fVar150 +
                 ((fVar161 + fVar138) * fVar191 - (fVar86 + fVar52) * fVar106) * fVar202 +
                 (fVar106 * (fVar186 + fVar152) - (fVar161 + fVar138) * fVar203) * fVar146;
            auVar55._4_4_ =
                 (fVar204 * (fVar125 + fVar63) - (fVar187 + fVar189) * fVar193) * fVar150 +
                 ((fVar164 + fVar144) * fVar193 - (fVar125 + fVar63) * fVar122) * fVar202 +
                 (fVar122 * (fVar187 + fVar189) - (fVar164 + fVar144) * fVar204) * fVar146;
            auVar55._8_4_ =
                 (fVar205 * (fVar104 + fVar64) - (fVar151 + fVar158) * fVar194) * fVar150 +
                 ((fVar167 + fVar160) * fVar194 - (fVar104 + fVar64) * fVar123) * fVar202 +
                 (fVar123 * (fVar151 + fVar158) - (fVar167 + fVar160) * fVar205) * fVar146;
            auVar55._12_4_ =
                 (fVar206 * (fVar105 + fVar65) - (fVar188 + fVar159) * fVar195) * fVar150 +
                 ((fVar185 + fVar148) * fVar195 - (fVar105 + fVar65) * fVar124) * fVar202 +
                 (fVar124 * (fVar188 + fVar159) - (fVar185 + fVar148) * fVar206) * fVar146;
            local_10a8 = fVar153 + local_10b8._0_4_ + auVar55._0_4_;
            fStack_10a4 = fVar157 + local_10b8._4_4_ + auVar55._4_4_;
            fStack_10a0 = auVar155._8_4_ + local_10b8._8_4_ + auVar55._8_4_;
            fStack_109c = auVar155._12_4_ + local_10b8._12_4_ + auVar55._12_4_;
            auVar183._8_4_ = auVar155._8_4_;
            auVar183._0_8_ = auVar155._0_8_;
            auVar183._12_4_ = auVar155._12_4_;
            auVar181 = minps(auVar183,local_10b8);
            auVar87 = minps(auVar181,auVar55);
            auVar134._8_4_ = auVar155._8_4_;
            auVar134._0_8_ = auVar155._0_8_;
            auVar134._12_4_ = auVar155._12_4_;
            auVar181 = maxps(auVar134,local_10b8);
            auVar181 = maxps(auVar181,auVar55);
            auVar135._4_4_ = -(uint)(auVar181._4_4_ <= ABS(fStack_10a4) * 1.1920929e-07);
            auVar135._0_4_ = -(uint)(auVar181._0_4_ <= ABS(local_10a8) * 1.1920929e-07);
            auVar135._8_4_ = -(uint)(auVar181._8_4_ <= ABS(fStack_10a0) * 1.1920929e-07);
            auVar135._12_4_ = -(uint)(auVar181._12_4_ <= ABS(fStack_109c) * 1.1920929e-07);
            auVar184._4_4_ = -(uint)(-(ABS(fStack_10a4) * 1.1920929e-07) <= auVar87._4_4_);
            auVar184._0_4_ = -(uint)(-(ABS(local_10a8) * 1.1920929e-07) <= auVar87._0_4_);
            auVar184._8_4_ = -(uint)(-(ABS(fStack_10a0) * 1.1920929e-07) <= auVar87._8_4_);
            auVar184._12_4_ = -(uint)(-(ABS(fStack_109c) * 1.1920929e-07) <= auVar87._12_4_);
            auVar135 = auVar135 | auVar184;
            iVar30 = movmskps((int)&local_1210,auVar135);
            if (iVar30 != 0) {
              uVar40 = -(uint)(ABS(fVar203 * fVar139) <= ABS(fVar163 * fVar162));
              uVar43 = -(uint)(ABS(fVar204 * fVar145) <= ABS(fVar166 * fVar165));
              uVar46 = -(uint)(ABS(fVar205 * fVar147) <= ABS(fVar169 * fVar168));
              uVar49 = -(uint)(ABS(fVar206 * fVar149) <= ABS(fVar171 * fVar170));
              uVar41 = -(uint)(ABS(fVar173 * fVar191) <= ABS(fVar172 * fVar139));
              uVar44 = -(uint)(ABS(fVar175 * fVar193) <= ABS(fVar174 * fVar145));
              uVar47 = -(uint)(ABS(fVar177 * fVar194) <= ABS(fVar176 * fVar147));
              uVar50 = -(uint)(ABS(fVar179 * fVar195) <= ABS(fVar178 * fVar149));
              uVar42 = -(uint)(ABS(fVar106 * fVar163) <= ABS(fVar173 * fVar190));
              uVar45 = -(uint)(ABS(fVar122 * fVar166) <= ABS(fVar175 * fVar192));
              uVar48 = -(uint)(ABS(fVar123 * fVar169) <= ABS(fVar177 * fStack_1220));
              uVar51 = -(uint)(ABS(fVar124 * fVar171) <= ABS(fVar179 * fStack_121c));
              local_1148[0] =
                   (float)(~uVar40 & (uint)(fVar190 * fVar139 - fVar163 * fVar162) |
                          (uint)(fVar163 * fVar191 - fVar203 * fVar139) & uVar40);
              local_1148[1] =
                   (float)(~uVar43 & (uint)(fVar192 * fVar145 - fVar166 * fVar165) |
                          (uint)(fVar166 * fVar193 - fVar204 * fVar145) & uVar43);
              local_1148[2] =
                   (float)(~uVar46 & (uint)(fStack_1220 * fVar147 - fVar169 * fVar168) |
                          (uint)(fVar169 * fVar194 - fVar205 * fVar147) & uVar46);
              local_1148[3] =
                   (float)(~uVar49 & (uint)(fStack_121c * fVar149 - fVar171 * fVar170) |
                          (uint)(fVar171 * fVar195 - fVar206 * fVar149) & uVar49);
              local_1138[0] =
                   (float)(~uVar41 & (uint)(fVar162 * fVar173 - fVar172 * fVar139) |
                          (uint)(fVar106 * fVar139 - fVar173 * fVar191) & uVar41);
              local_1138[1] =
                   (float)(~uVar44 & (uint)(fVar165 * fVar175 - fVar174 * fVar145) |
                          (uint)(fVar122 * fVar145 - fVar175 * fVar193) & uVar44);
              local_1138[2] =
                   (float)(~uVar47 & (uint)(fVar168 * fVar177 - fVar176 * fVar147) |
                          (uint)(fVar123 * fVar147 - fVar177 * fVar194) & uVar47);
              local_1138[3] =
                   (float)(~uVar50 & (uint)(fVar170 * fVar179 - fVar178 * fVar149) |
                          (uint)(fVar124 * fVar149 - fVar179 * fVar195) & uVar50);
              local_1128[0] =
                   (float)(~uVar42 & (uint)(fVar172 * fVar163 - fVar173 * fVar190) |
                          (uint)(fVar173 * fVar203 - fVar106 * fVar163) & uVar42);
              local_1128[1] =
                   (float)(~uVar45 & (uint)(fVar174 * fVar166 - fVar175 * fVar192) |
                          (uint)(fVar175 * fVar204 - fVar122 * fVar166) & uVar45);
              local_1128[2] =
                   (float)(~uVar48 & (uint)(fVar176 * fVar169 - fVar177 * fStack_1220) |
                          (uint)(fVar177 * fVar205 - fVar123 * fVar169) & uVar48);
              local_1128[3] =
                   (float)(~uVar51 & (uint)(fVar178 * fVar171 - fVar179 * fStack_121c) |
                          (uint)(fVar179 * fVar206 - fVar124 * fVar171) & uVar51);
              fVar144 = fVar150 * local_1148[0] + fVar202 * local_1138[0] + fVar146 * local_1128[0];
              fVar167 = fVar150 * local_1148[1] + fVar202 * local_1138[1] + fVar146 * local_1128[1];
              fVar148 = fVar150 * local_1148[2] + fVar202 * local_1138[2] + fVar146 * local_1128[2];
              fVar185 = fVar150 * local_1148[3] + fVar202 * local_1138[3] + fVar146 * local_1128[3];
              auVar92._0_4_ = fVar144 + fVar144;
              auVar92._4_4_ = fVar167 + fVar167;
              auVar92._8_4_ = fVar148 + fVar148;
              auVar92._12_4_ = fVar185 + fVar185;
              auVar115._0_4_ = local_1098 * local_1138[0] + fVar196 * local_1128[0];
              auVar115._4_4_ = fStack_1094 * local_1138[1] + fVar197 * local_1128[1];
              auVar115._8_4_ = fStack_1090 * local_1138[2] + fVar198 * local_1128[2];
              auVar115._12_4_ = fStack_108c * local_1138[3] + fVar200 * local_1128[3];
              fVar148 = (float)local_1238._0_4_ * local_1148[0] + auVar115._0_4_;
              fVar185 = (float)local_1238._4_4_ * local_1148[1] + auVar115._4_4_;
              fVar159 = fStack_1230 * local_1148[2] + auVar115._8_4_;
              fVar188 = fStack_122c * local_1148[3] + auVar115._12_4_;
              auVar181 = rcpps(auVar115,auVar92);
              fVar144 = auVar181._0_4_;
              fVar167 = auVar181._4_4_;
              fVar189 = auVar181._8_4_;
              fVar151 = auVar181._12_4_;
              fVar148 = ((1.0 - auVar92._0_4_ * fVar144) * fVar144 + fVar144) * (fVar148 + fVar148);
              fVar185 = ((1.0 - auVar92._4_4_ * fVar167) * fVar167 + fVar167) * (fVar185 + fVar185);
              fVar189 = ((1.0 - auVar92._8_4_ * fVar189) * fVar189 + fVar189) * (fVar159 + fVar159);
              fVar151 = ((1.0 - auVar92._12_4_ * fVar151) * fVar151 + fVar151) * (fVar188 + fVar188)
              ;
              fVar144 = *(float *)(ray + k * 4 + 0x80);
              fVar167 = *(float *)(ray + k * 4 + 0x30);
              auVar116._0_4_ = -(uint)(fVar148 <= fVar144 && fVar167 <= fVar148) & auVar135._0_4_;
              auVar116._4_4_ = -(uint)(fVar185 <= fVar144 && fVar167 <= fVar185) & auVar135._4_4_;
              auVar116._8_4_ = -(uint)(fVar189 <= fVar144 && fVar167 <= fVar189) & auVar135._8_4_;
              auVar116._12_4_ = -(uint)(fVar151 <= fVar144 && fVar167 <= fVar151) & auVar135._12_4_;
              iVar30 = movmskps(iVar30,auVar116);
              if (iVar30 != 0) {
                valid.field_0.i[0] = auVar116._0_4_ & -(uint)(auVar92._0_4_ != 0.0);
                valid.field_0.i[1] = auVar116._4_4_ & -(uint)(auVar92._4_4_ != 0.0);
                valid.field_0.i[2] = auVar116._8_4_ & -(uint)(auVar92._8_4_ != 0.0);
                valid.field_0.i[3] = auVar116._12_4_ & -(uint)(auVar92._12_4_ != 0.0);
                iVar30 = movmskps(iVar30,(undefined1  [16])valid.field_0);
                if (iVar30 != 0) {
                  uStack_1290 = auVar155._8_8_;
                  tNear.field_0._8_8_ = uStack_1290;
                  tNear.field_0._0_8_ = auVar155._0_8_;
                  auVar14._4_4_ = fStack_10a4;
                  auVar14._0_4_ = local_10a8;
                  auVar14._8_4_ = fStack_10a0;
                  auVar14._12_4_ = fStack_109c;
                  local_1158[0] = fVar148;
                  local_1158[1] = fVar185;
                  local_1158[2] = fVar189;
                  local_1158[3] = fVar151;
                  pGVar9 = (context->scene->geometries).items[uVar18].ptr;
                  if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                    auVar181 = rcpps((undefined1  [16])valid.field_0,auVar14);
                    fVar144 = auVar181._0_4_;
                    fVar167 = auVar181._4_4_;
                    fVar159 = auVar181._8_4_;
                    fVar188 = auVar181._12_4_;
                    fVar144 = (float)(-(uint)(1e-18 <= ABS(local_10a8)) &
                                     (uint)(((float)DAT_01feca10 - local_10a8 * fVar144) * fVar144 +
                                           fVar144));
                    fVar167 = (float)(-(uint)(1e-18 <= ABS(fStack_10a4)) &
                                     (uint)((DAT_01feca10._4_4_ - fStack_10a4 * fVar167) * fVar167 +
                                           fVar167));
                    fVar159 = (float)(-(uint)(1e-18 <= ABS(fStack_10a0)) &
                                     (uint)((DAT_01feca10._8_4_ - fStack_10a0 * fVar159) * fVar159 +
                                           fVar159));
                    fVar188 = (float)(-(uint)(1e-18 <= ABS(fStack_109c)) &
                                     (uint)((DAT_01feca10._12_4_ - fStack_109c * fVar188) * fVar188
                                           + fVar188));
                    auVar93._0_4_ = fVar153 * fVar144;
                    auVar93._4_4_ = fVar157 * fVar167;
                    auVar93._8_4_ = auVar155._8_4_ * fVar159;
                    auVar93._12_4_ = auVar155._12_4_ * fVar188;
                    auVar87 = minps(auVar93,_DAT_01feca10);
                    auVar73._0_4_ = fVar144 * local_10b8._0_4_;
                    auVar73._4_4_ = fVar167 * local_10b8._4_4_;
                    auVar73._8_4_ = fVar159 * local_10b8._8_4_;
                    auVar73._12_4_ = fVar188 * local_10b8._12_4_;
                    auVar181 = minps(auVar73,_DAT_01feca10);
                    uVar40 = *(uint *)(local_1210 + 4);
                    pcVar3 = local_1210 + uVar26 * 4;
                    uVar41 = *(uint *)pcVar3;
                    uVar42 = *(uint *)(pcVar3 + 4);
                    uVar43 = *(uint *)(local_1210 + 8);
                    uVar44 = *(uint *)(pcVar3 + 8);
                    if (uVar26 == 2) {
                      uVar43 = uVar40;
                      uVar44 = uVar42;
                    }
                    fVar63 = auVar87._0_4_;
                    fVar104 = auVar87._4_4_;
                    fVar65 = auVar87._8_4_;
                    fVar105 = auVar87._12_4_;
                    fVar144 = auVar181._0_4_;
                    fVar167 = auVar181._4_4_;
                    fVar159 = auVar181._8_4_;
                    fVar188 = auVar181._12_4_;
                    fVar202 = (1.0 - fVar63) - fVar144;
                    fVar146 = (1.0 - fVar104) - fVar167;
                    fVar106 = (1.0 - fVar65) - fVar159;
                    fVar150 = (1.0 - fVar105) - fVar188;
                    local_1168._0_4_ =
                         fVar202 * (float)(*(uint *)local_1210 >> 0x10) * 0.00012207031 +
                         (float)(uVar41 >> 0x10) * 0.00012207031 * fVar144 +
                         (float)(uVar40 >> 0x10) * 0.00012207031 * fVar63;
                    local_1168._4_4_ =
                         fVar146 * (float)(uVar41 >> 0x10) * 0.00012207031 +
                         (float)(uVar42 >> 0x10) * 0.00012207031 * fVar167 +
                         (float)(uVar40 >> 0x10) * 0.00012207031 * fVar104;
                    local_1168._8_4_ =
                         fVar106 * (float)(uVar40 >> 0x10) * 0.00012207031 +
                         (float)(uVar42 >> 0x10) * 0.00012207031 * fVar159 +
                         (float)(uVar43 >> 0x10) * 0.00012207031 * fVar65;
                    local_1168._12_4_ =
                         fVar150 * (float)(uVar42 >> 0x10) * 0.00012207031 +
                         (float)(uVar44 >> 0x10) * 0.00012207031 * fVar188 +
                         (float)(uVar43 >> 0x10) * 0.00012207031 * fVar105;
                    local_1178[1] =
                         (float)(uVar41 & 0xffff) * 0.00012207031 * fVar146 +
                         (float)(uVar42 & 0xffff) * 0.00012207031 * fVar167 +
                         (float)(uVar40 & 0xffff) * 0.00012207031 * fVar104;
                    local_1178[0] =
                         (float)(*(uint *)local_1210 & 0xffff) * 0.00012207031 * fVar202 +
                         (float)(uVar41 & 0xffff) * 0.00012207031 * fVar144 +
                         (float)(uVar40 & 0xffff) * 0.00012207031 * fVar63;
                    local_1178[2] =
                         (float)(uVar40 & 0xffff) * 0.00012207031 * fVar106 +
                         (float)(uVar42 & 0xffff) * 0.00012207031 * fVar159 +
                         (float)(uVar43 & 0xffff) * 0.00012207031 * fVar65;
                    local_1178[3] =
                         (float)(uVar42 & 0xffff) * 0.00012207031 * fVar150 +
                         (float)(uVar44 & 0xffff) * 0.00012207031 * fVar188 +
                         (float)(uVar43 & 0xffff) * 0.00012207031 * fVar105;
                    auVar12._4_4_ = fVar185;
                    auVar12._0_4_ = fVar148;
                    auVar12._8_4_ = fVar189;
                    auVar12._12_4_ = fVar151;
                    auVar87 = ~(undefined1  [16])valid.field_0 & _DAT_01feb9f0 |
                              auVar12 & (undefined1  [16])valid.field_0;
                    auVar117._4_4_ = auVar87._0_4_;
                    auVar117._0_4_ = auVar87._4_4_;
                    auVar117._8_4_ = auVar87._12_4_;
                    auVar117._12_4_ = auVar87._8_4_;
                    auVar181 = minps(auVar117,auVar87);
                    auVar74._0_8_ = auVar181._8_8_;
                    auVar74._8_4_ = auVar181._0_4_;
                    auVar74._12_4_ = auVar181._4_4_;
                    auVar181 = minps(auVar74,auVar181);
                    auVar75._0_8_ =
                         CONCAT44(-(uint)(auVar181._4_4_ == auVar87._4_4_) & valid.field_0.i[1],
                                  -(uint)(auVar181._0_4_ == auVar87._0_4_) & valid.field_0.i[0]);
                    auVar75._8_4_ = -(uint)(auVar181._8_4_ == auVar87._8_4_) & valid.field_0.i[2];
                    auVar75._12_4_ = -(uint)(auVar181._12_4_ == auVar87._12_4_) & valid.field_0.i[3]
                    ;
                    iVar30 = movmskps(uVar31,auVar75);
                    aVar56 = valid.field_0;
                    if (iVar30 != 0) {
                      aVar56.i[2] = auVar75._8_4_;
                      aVar56._0_8_ = auVar75._0_8_;
                      aVar56.i[3] = auVar75._12_4_;
                    }
                    uVar31 = movmskps(iVar30,(undefined1  [16])aVar56);
                    lVar38 = 0;
                    if (uVar31 != 0) {
                      for (; (uVar31 >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
                      }
                    }
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      fVar144 = local_1178[lVar38];
                      fVar167 = local_1158[lVar38 + -4];
                      fVar148 = local_1148[lVar38];
                      fVar185 = local_1138[lVar38];
                      fVar189 = local_1128[lVar38];
                      *(float *)(ray + k * 4 + 0x80) = local_1158[lVar38];
                      *(float *)(ray + k * 4 + 0xc0) = fVar148;
                      *(float *)(ray + k * 4 + 0xd0) = fVar185;
                      *(float *)(ray + k * 4 + 0xe0) = fVar189;
                      *(float *)(ray + k * 4 + 0xf0) = fVar144;
                      *(float *)(ray + k * 4 + 0x100) = fVar167;
                      *(uint *)(ray + k * 4 + 0x110) = uVar39;
                      *(uint *)(ray + k * 4 + 0x120) = uVar18;
                      *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      uVar36 = local_10f8;
                    }
                    else {
                      local_12b8 = CONCAT44(uVar18,uVar18);
                      local_1298 = CONCAT44(uVar39,uVar39);
                      uStack_1290._0_4_ = uVar39;
                      uStack_1290._4_4_ = uVar39;
                      uVar10 = *local_1100;
                      uVar11 = local_1100[1];
                      local_1208 = uVar26;
                      local_1200 = uVar33;
                      do {
                        uVar32 = *(undefined4 *)(ray + k * 4 + 0x80);
                        local_fd8 = local_1178[lVar38];
                        fVar144 = local_1158[lVar38 + -4];
                        *(float *)(ray + k * 4 + 0x80) = local_1158[lVar38];
                        args.context = context->user;
                        local_fc8._4_4_ = fVar144;
                        local_fc8._0_4_ = fVar144;
                        local_fc8._8_4_ = fVar144;
                        local_fc8._12_4_ = fVar144;
                        local_1008 = local_1148[lVar38];
                        fVar144 = local_1138[lVar38];
                        local_fe8 = local_1128[lVar38];
                        local_ff8._4_4_ = fVar144;
                        local_ff8._0_4_ = fVar144;
                        local_ff8._8_4_ = fVar144;
                        local_ff8._12_4_ = fVar144;
                        fStack_1004 = local_1008;
                        fStack_1000 = local_1008;
                        fStack_ffc = local_1008;
                        fStack_fe4 = local_fe8;
                        fStack_fe0 = local_fe8;
                        fStack_fdc = local_fe8;
                        fStack_fd4 = local_fd8;
                        fStack_fd0 = local_fd8;
                        fStack_fcc = local_fd8;
                        local_fb8 = local_1298;
                        uStack_fb0 = uStack_1290;
                        local_fa8 = local_12b8;
                        uStack_fa0 = CONCAT44(uVar18,uVar18);
                        local_f98 = (args.context)->instID[0];
                        uStack_f94 = local_f98;
                        uStack_f90 = local_f98;
                        uStack_f8c = local_f98;
                        local_f88 = (args.context)->instPrimID[0];
                        uStack_f84 = local_f88;
                        uStack_f80 = local_f88;
                        uStack_f7c = local_f88;
                        args.valid = (int *)&local_1248;
                        pRVar28 = (RTCIntersectArguments *)pGVar9->userPtr;
                        args.hit = (RTCHitN *)&local_1008;
                        args.N = 4;
                        p_Var24 = pGVar9->intersectionFilterN;
                        local_1248 = uVar10;
                        uStack_1240 = uVar11;
                        args.geometryUserPtr = pRVar28;
                        args.ray = (RTCRayN *)ray;
                        if (p_Var24 != (RTCFilterFunctionN)0x0) {
                          p_Var24 = (RTCFilterFunctionN)(*p_Var24)(&args);
                        }
                        auVar60._0_4_ = -(uint)((int)local_1248 == 0);
                        auVar60._4_4_ = -(uint)(local_1248._4_4_ == 0);
                        auVar60._8_4_ = -(uint)((int)uStack_1240 == 0);
                        auVar60._12_4_ = -(uint)(uStack_1240._4_4_ == 0);
                        uVar31 = movmskps((int)p_Var24,auVar60);
                        pRVar22 = (RTCRayN *)(ulong)(uVar31 ^ 0xf);
                        if ((uVar31 ^ 0xf) == 0) {
                          auVar60 = auVar60 ^ _DAT_01febe20;
                        }
                        else {
                          pRVar28 = context->args;
                          p_Var24 = pRVar28->filter;
                          if ((p_Var24 != (RTCFilterFunctionN)0x0) &&
                             (((pRVar28->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                            p_Var24 = (RTCFilterFunctionN)(*p_Var24)(&args);
                          }
                          auVar81._0_4_ = -(uint)((int)local_1248 == 0);
                          auVar81._4_4_ = -(uint)(local_1248._4_4_ == 0);
                          auVar81._8_4_ = -(uint)((int)uStack_1240 == 0);
                          auVar81._12_4_ = -(uint)(uStack_1240._4_4_ == 0);
                          auVar60 = auVar81 ^ _DAT_01febe20;
                          uVar31 = movmskps((int)p_Var24,auVar81);
                          pRVar22 = (RTCRayN *)(ulong)(uVar31 ^ 0xf);
                          if ((uVar31 ^ 0xf) != 0) {
                            auVar99._0_4_ = *(uint *)(args.ray + 0xc0) & auVar81._0_4_;
                            auVar99._4_4_ = *(uint *)(args.ray + 0xc4) & auVar81._4_4_;
                            auVar99._8_4_ = *(uint *)(args.ray + 200) & auVar81._8_4_;
                            auVar99._12_4_ = *(uint *)(args.ray + 0xcc) & auVar81._12_4_;
                            auVar143._0_4_ = ~auVar81._0_4_ & *(uint *)args.hit;
                            auVar143._4_4_ = ~auVar81._4_4_ & *(uint *)(args.hit + 4);
                            auVar143._8_4_ = ~auVar81._8_4_ & *(uint *)(args.hit + 8);
                            auVar143._12_4_ = ~auVar81._12_4_ & *(uint *)(args.hit + 0xc);
                            *(undefined1 (*) [16])(args.ray + 0xc0) = auVar143 | auVar99;
                            uVar31 = *(uint *)(args.hit + 0x14);
                            uVar39 = *(uint *)(args.hit + 0x18);
                            uVar40 = *(uint *)(args.hit + 0x1c);
                            *(uint *)(args.ray + 0xd0) =
                                 ~auVar81._0_4_ & *(uint *)(args.hit + 0x10) |
                                 *(uint *)(args.ray + 0xd0) & auVar81._0_4_;
                            *(uint *)(args.ray + 0xd4) =
                                 ~auVar81._4_4_ & uVar31 |
                                 *(uint *)(args.ray + 0xd4) & auVar81._4_4_;
                            *(uint *)(args.ray + 0xd8) =
                                 ~auVar81._8_4_ & uVar39 |
                                 *(uint *)(args.ray + 0xd8) & auVar81._8_4_;
                            *(uint *)(args.ray + 0xdc) =
                                 ~auVar81._12_4_ & uVar40 |
                                 *(uint *)(args.ray + 0xdc) & auVar81._12_4_;
                            uVar31 = *(uint *)(args.hit + 0x24);
                            uVar39 = *(uint *)(args.hit + 0x28);
                            uVar40 = *(uint *)(args.hit + 0x2c);
                            *(uint *)(args.ray + 0xe0) =
                                 ~auVar81._0_4_ & *(uint *)(args.hit + 0x20) |
                                 *(uint *)(args.ray + 0xe0) & auVar81._0_4_;
                            *(uint *)(args.ray + 0xe4) =
                                 ~auVar81._4_4_ & uVar31 |
                                 *(uint *)(args.ray + 0xe4) & auVar81._4_4_;
                            *(uint *)(args.ray + 0xe8) =
                                 ~auVar81._8_4_ & uVar39 |
                                 *(uint *)(args.ray + 0xe8) & auVar81._8_4_;
                            *(uint *)(args.ray + 0xec) =
                                 ~auVar81._12_4_ & uVar40 |
                                 *(uint *)(args.ray + 0xec) & auVar81._12_4_;
                            auVar137._0_4_ = *(uint *)(args.ray + 0xf0) & auVar81._0_4_;
                            auVar137._4_4_ = *(uint *)(args.ray + 0xf4) & auVar81._4_4_;
                            auVar137._8_4_ = *(uint *)(args.ray + 0xf8) & auVar81._8_4_;
                            auVar137._12_4_ = *(uint *)(args.ray + 0xfc) & auVar81._12_4_;
                            auVar100._0_4_ = ~auVar81._0_4_ & *(uint *)(args.hit + 0x30);
                            auVar100._4_4_ = ~auVar81._4_4_ & *(uint *)(args.hit + 0x34);
                            auVar100._8_4_ = ~auVar81._8_4_ & *(uint *)(args.hit + 0x38);
                            auVar100._12_4_ = ~auVar81._12_4_ & *(uint *)(args.hit + 0x3c);
                            *(undefined1 (*) [16])(args.ray + 0xf0) = auVar100 | auVar137;
                            uVar31 = *(uint *)(args.hit + 0x44);
                            uVar39 = *(uint *)(args.hit + 0x48);
                            uVar40 = *(uint *)(args.hit + 0x4c);
                            *(uint *)(args.ray + 0x100) =
                                 ~auVar81._0_4_ & *(uint *)(args.hit + 0x40) |
                                 *(uint *)(args.ray + 0x100) & auVar81._0_4_;
                            *(uint *)(args.ray + 0x104) =
                                 ~auVar81._4_4_ & uVar31 |
                                 *(uint *)(args.ray + 0x104) & auVar81._4_4_;
                            *(uint *)(args.ray + 0x108) =
                                 ~auVar81._8_4_ & uVar39 |
                                 *(uint *)(args.ray + 0x108) & auVar81._8_4_;
                            *(uint *)(args.ray + 0x10c) =
                                 ~auVar81._12_4_ & uVar40 |
                                 *(uint *)(args.ray + 0x10c) & auVar81._12_4_;
                            uVar31 = *(uint *)(args.hit + 0x54);
                            uVar39 = *(uint *)(args.hit + 0x58);
                            uVar40 = *(uint *)(args.hit + 0x5c);
                            *(uint *)(args.ray + 0x110) =
                                 *(uint *)(args.ray + 0x110) & auVar81._0_4_ |
                                 ~auVar81._0_4_ & *(uint *)(args.hit + 0x50);
                            *(uint *)(args.ray + 0x114) =
                                 *(uint *)(args.ray + 0x114) & auVar81._4_4_ |
                                 ~auVar81._4_4_ & uVar31;
                            *(uint *)(args.ray + 0x118) =
                                 *(uint *)(args.ray + 0x118) & auVar81._8_4_ |
                                 ~auVar81._8_4_ & uVar39;
                            *(uint *)(args.ray + 0x11c) =
                                 *(uint *)(args.ray + 0x11c) & auVar81._12_4_ |
                                 ~auVar81._12_4_ & uVar40;
                            uVar31 = *(uint *)(args.hit + 100);
                            uVar39 = *(uint *)(args.hit + 0x68);
                            uVar40 = *(uint *)(args.hit + 0x6c);
                            *(uint *)(args.ray + 0x120) =
                                 *(uint *)(args.ray + 0x120) & auVar81._0_4_ |
                                 ~auVar81._0_4_ & *(uint *)(args.hit + 0x60);
                            *(uint *)(args.ray + 0x124) =
                                 *(uint *)(args.ray + 0x124) & auVar81._4_4_ |
                                 ~auVar81._4_4_ & uVar31;
                            *(uint *)(args.ray + 0x128) =
                                 *(uint *)(args.ray + 0x128) & auVar81._8_4_ |
                                 ~auVar81._8_4_ & uVar39;
                            *(uint *)(args.ray + 300) =
                                 *(uint *)(args.ray + 300) & auVar81._12_4_ |
                                 ~auVar81._12_4_ & uVar40;
                            auVar101._0_4_ = *(uint *)(args.ray + 0x130) & auVar81._0_4_;
                            auVar101._4_4_ = *(uint *)(args.ray + 0x134) & auVar81._4_4_;
                            auVar101._8_4_ = *(uint *)(args.ray + 0x138) & auVar81._8_4_;
                            auVar101._12_4_ = *(uint *)(args.ray + 0x13c) & auVar81._12_4_;
                            auVar120._0_4_ = ~auVar81._0_4_ & *(uint *)(args.hit + 0x70);
                            auVar120._4_4_ = ~auVar81._4_4_ & *(uint *)(args.hit + 0x74);
                            auVar120._8_4_ = ~auVar81._8_4_ & *(uint *)(args.hit + 0x78);
                            auVar120._12_4_ = ~auVar81._12_4_ & *(uint *)(args.hit + 0x7c);
                            *(undefined1 (*) [16])(args.ray + 0x130) = auVar120 | auVar101;
                            auVar102._0_4_ = *(uint *)(args.ray + 0x140) & auVar81._0_4_;
                            auVar102._4_4_ = *(uint *)(args.ray + 0x144) & auVar81._4_4_;
                            auVar102._8_4_ = *(uint *)(args.ray + 0x148) & auVar81._8_4_;
                            auVar102._12_4_ = *(uint *)(args.ray + 0x14c) & auVar81._12_4_;
                            auVar82._0_4_ = ~auVar81._0_4_ & *(uint *)(args.hit + 0x80);
                            auVar82._4_4_ = ~auVar81._4_4_ & *(uint *)(args.hit + 0x84);
                            auVar82._8_4_ = ~auVar81._8_4_ & *(uint *)(args.hit + 0x88);
                            auVar82._12_4_ = ~auVar81._12_4_ & *(uint *)(args.hit + 0x8c);
                            *(undefined1 (*) [16])(args.ray + 0x140) = auVar82 | auVar102;
                            pRVar22 = args.ray;
                            pRVar28 = (RTCIntersectArguments *)args.hit;
                          }
                        }
                        auVar61._0_4_ = auVar60._0_4_ << 0x1f;
                        auVar61._4_4_ = auVar60._4_4_ << 0x1f;
                        auVar61._8_4_ = auVar60._8_4_ << 0x1f;
                        auVar61._12_4_ = auVar60._12_4_ << 0x1f;
                        iVar30 = movmskps((int)pRVar22,auVar61);
                        if (iVar30 == 0) {
                          *(undefined4 *)(ray + k * 4 + 0x80) = uVar32;
                        }
                        valid.field_0.v[lVar38] = 0.0;
                        fVar144 = *(float *)(ray + k * 4 + 0x80);
                        valid.field_0.i[0] = -(uint)(fVar148 <= fVar144) & valid.field_0.i[0];
                        valid.field_0.i[1] = -(uint)(fVar185 <= fVar144) & valid.field_0.i[1];
                        valid.field_0.i[2] = -(uint)(fVar189 <= fVar144) & valid.field_0.i[2];
                        valid.field_0.i[3] = -(uint)(fVar151 <= fVar144) & valid.field_0.i[3];
                        iVar30 = movmskps(iVar30,(undefined1  [16])valid.field_0);
                        if (iVar30 != 0) {
                          auVar83._0_4_ = valid.field_0.i[0] & (uint)fVar148;
                          auVar83._4_4_ = valid.field_0.i[1] & (uint)fVar185;
                          auVar83._8_4_ = valid.field_0.i[2] & (uint)fVar189;
                          auVar83._12_4_ = valid.field_0.i[3] & (uint)fVar151;
                          auVar103._0_8_ =
                               CONCAT44(~valid.field_0.i[1],~valid.field_0.i[0]) &
                               0x7f8000007f800000;
                          auVar103._8_4_ = ~valid.field_0.i[2] & 0x7f800000;
                          auVar103._12_4_ = ~valid.field_0.i[3] & 0x7f800000;
                          auVar103 = auVar103 | auVar83;
                          auVar121._4_4_ = auVar103._0_4_;
                          auVar121._0_4_ = auVar103._4_4_;
                          auVar121._8_4_ = auVar103._12_4_;
                          auVar121._12_4_ = auVar103._8_4_;
                          auVar181 = minps(auVar121,auVar103);
                          auVar84._0_8_ = auVar181._8_8_;
                          auVar84._8_4_ = auVar181._0_4_;
                          auVar84._12_4_ = auVar181._4_4_;
                          auVar181 = minps(auVar84,auVar181);
                          auVar85._0_8_ =
                               CONCAT44(-(uint)(auVar181._4_4_ == auVar103._4_4_) &
                                        valid.field_0.i[1],
                                        -(uint)(auVar181._0_4_ == auVar103._0_4_) &
                                        valid.field_0.i[0]);
                          auVar85._8_4_ =
                               -(uint)(auVar181._8_4_ == auVar103._8_4_) & valid.field_0.i[2];
                          auVar85._12_4_ =
                               -(uint)(auVar181._12_4_ == auVar103._12_4_) & valid.field_0.i[3];
                          iVar25 = movmskps((int)pRVar28,auVar85);
                          aVar62 = valid.field_0;
                          if (iVar25 != 0) {
                            aVar62.i[2] = auVar85._8_4_;
                            aVar62._0_8_ = auVar85._0_8_;
                            aVar62.i[3] = auVar85._12_4_;
                          }
                          uVar32 = movmskps(iVar25,(undefined1  [16])aVar62);
                          uVar36 = CONCAT44((int)((ulong)pRVar28 >> 0x20),uVar32);
                          lVar38 = 0;
                          if (uVar36 != 0) {
                            for (; (uVar36 >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
                            }
                          }
                        }
                        uVar36 = local_10f8;
                      } while ((char)iVar30 != '\0');
                    }
                  }
                }
              }
            }
          }
          sVar21 = 0;
          fVar144 = local_1018;
          fVar159 = fStack_1014;
          fVar188 = fStack_1010;
          fVar63 = fStack_100c;
          fVar167 = local_1028;
          fVar104 = fStack_1024;
          fVar65 = fStack_1020;
          fVar105 = fStack_101c;
          iVar30 = local_10d8;
          iVar25 = iStack_10d4;
          iVar199 = iStack_10d0;
          iVar201 = iStack_10cc;
          fVar202 = local_1078;
          fVar146 = fStack_1074;
          fVar106 = fStack_1070;
          fVar150 = fStack_106c;
          fVar125 = local_10e8;
          fVar52 = fStack_10e4;
          fVar64 = fStack_10e0;
          fVar86 = fStack_10dc;
          fVar151 = local_1068;
          fVar122 = fStack_1064;
          fVar123 = fStack_1060;
          fVar124 = fStack_105c;
          fVar160 = local_10c8;
          fVar138 = fStack_10c4;
          fVar139 = fStack_10c0;
          fVar145 = fStack_10bc;
          fVar148 = local_1038;
          fVar147 = fStack_1034;
          fVar149 = fStack_1030;
          fVar152 = fStack_102c;
          fVar185 = local_1048;
          fVar153 = fStack_1044;
          fVar157 = fStack_1040;
          fVar158 = fStack_103c;
          fVar189 = local_1058;
          fVar161 = fStack_1054;
          fVar162 = fStack_1050;
          fVar163 = fStack_104c;
        }
        else {
          pGVar29 = (GridSOA *)(uVar19 & 0xfffffffffffffff0);
          sVar21 = *(size_t *)(pGVar29->data + pGVar29->rootOffset);
          (pre->super_Precalculations).grid = pGVar29;
        }
        uVar32 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar181._4_4_ = uVar32;
        auVar181._0_4_ = uVar32;
        auVar181._8_4_ = uVar32;
        auVar181._12_4_ = uVar32;
        if (sVar21 != 0) {
          (local_10f0->ptr).ptr = sVar21;
          local_10f0->dist = 0;
          local_10f0 = local_10f0 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }